

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::sse2::CurveNiIntersector1<4>::
     intersect_t<embree::sse2::RibbonCurve1Intersector1<embree::CatmullRomCurveT,4>,embree::sse2::Intersect1EpilogMU<4,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  Primitive *pPVar3;
  undefined1 (*pauVar4) [12];
  Primitive PVar5;
  int iVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  float *pfVar12;
  undefined6 uVar13;
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  int iVar36;
  undefined4 uVar37;
  ulong uVar38;
  undefined1 *puVar39;
  RTCRayN *pRVar40;
  undefined4 uVar41;
  Geometry *pGVar42;
  Geometry *extraout_RDX;
  Geometry *extraout_RDX_00;
  Geometry *extraout_RDX_01;
  Geometry *extraout_RDX_02;
  long lVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  long lVar47;
  ulong uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  short sVar56;
  float fVar57;
  float fVar58;
  float fVar95;
  float fVar97;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  float fVar96;
  undefined8 uVar98;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar88;
  undefined1 auVar89 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar90;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar91;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar92;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar122;
  float fVar125;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar123;
  float fVar124;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar130;
  float fVar140;
  float fVar141;
  vfloat4 v;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar142;
  float fVar156;
  float fVar158;
  vfloat4 v_1;
  undefined1 auVar144 [16];
  float fVar143;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar157;
  float fVar159;
  float fVar160;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar161;
  float fVar162;
  float fVar172;
  float fVar174;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar173;
  float fVar175;
  float fVar176;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar177;
  float fVar199;
  float fVar200;
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar201;
  float fVar202;
  float fVar209;
  float fVar211;
  undefined1 auVar203 [16];
  undefined1 auVar206 [16];
  float fVar210;
  float fVar212;
  float fVar213;
  undefined1 auVar207 [16];
  float fVar214;
  undefined1 auVar208 [16];
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar239;
  float fVar240;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar241;
  float fVar243;
  float fVar244;
  undefined1 auVar242 [16];
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar255;
  float fVar257;
  float fVar259;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar252;
  float fVar256;
  float fVar258;
  float fVar260;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar253;
  undefined1 auVar254 [16];
  float fVar261;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar265;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar271;
  float fVar272;
  float fVar277;
  float fVar279;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar278;
  float fVar280;
  float fVar281;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  int local_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_468;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_458;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  undefined8 local_438;
  float fStack_430;
  float fStack_42c;
  ulong local_420;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [4];
  undefined1 auStack_3e4 [8];
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  RayQueryContext *local_3b8;
  ulong local_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  float local_2e8;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined8 local_268;
  float local_260;
  float local_25c;
  float local_258;
  undefined4 local_254;
  undefined4 local_250;
  uint local_24c;
  uint local_248;
  RayHit *local_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 uVar93;
  undefined2 uVar94;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  
  uVar35 = mm_lookupmask_ps._8_8_;
  uVar34 = mm_lookupmask_ps._0_8_;
  PVar5 = prim[1];
  uVar38 = (ulong)(byte)PVar5;
  pPVar3 = prim + uVar38 * 0x19 + 6;
  fVar141 = *(float *)(pPVar3 + 0xc);
  fVar142 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar3) * fVar141;
  fVar156 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar3 + 4)) * fVar141;
  fVar158 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar3 + 8)) * fVar141;
  fVar130 = fVar141 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar140 = fVar141 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar141 = fVar141 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar41 = *(undefined4 *)(prim + uVar38 * 4 + 6);
  uVar93 = (undefined1)((uint)uVar41 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar41 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar41));
  uVar93 = (undefined1)((uint)uVar41 >> 8);
  uVar13 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar93),uVar93);
  sVar56 = CONCAT11((char)uVar41,(char)uVar41);
  uVar48 = CONCAT62(uVar13,sVar56);
  auVar59._8_4_ = 0;
  auVar59._0_8_ = uVar48;
  auVar59._12_2_ = uVar94;
  auVar59._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar237._12_4_ = auVar59._12_4_;
  auVar237._8_2_ = 0;
  auVar237._0_8_ = uVar48;
  auVar237._10_2_ = uVar94;
  auVar69._10_6_ = auVar237._10_6_;
  auVar69._8_2_ = uVar94;
  auVar69._0_8_ = uVar48;
  uVar94 = (undefined2)uVar13;
  auVar14._4_8_ = auVar69._8_8_;
  auVar14._2_2_ = uVar94;
  auVar14._0_2_ = uVar94;
  fVar99 = (float)((int)sVar56 >> 8);
  fVar122 = (float)(auVar14._0_4_ >> 0x18);
  fVar125 = (float)(auVar69._8_4_ >> 0x18);
  uVar41 = *(undefined4 *)(prim + uVar38 * 5 + 6);
  uVar93 = (undefined1)((uint)uVar41 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar41 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar41));
  uVar93 = (undefined1)((uint)uVar41 >> 8);
  uVar13 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar93),uVar93);
  sVar56 = CONCAT11((char)uVar41,(char)uVar41);
  uVar48 = CONCAT62(uVar13,sVar56);
  auVar62._8_4_ = 0;
  auVar62._0_8_ = uVar48;
  auVar62._12_2_ = uVar94;
  auVar62._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._8_2_ = 0;
  auVar61._0_8_ = uVar48;
  auVar61._10_2_ = uVar94;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._8_2_ = uVar94;
  auVar60._0_8_ = uVar48;
  uVar94 = (undefined2)uVar13;
  auVar15._4_8_ = auVar60._8_8_;
  auVar15._2_2_ = uVar94;
  auVar15._0_2_ = uVar94;
  fVar161 = (float)((int)sVar56 >> 8);
  fVar172 = (float)(auVar15._0_4_ >> 0x18);
  fVar174 = (float)(auVar60._8_4_ >> 0x18);
  uVar41 = *(undefined4 *)(prim + uVar38 * 6 + 6);
  uVar93 = (undefined1)((uint)uVar41 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar41 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar41));
  uVar93 = (undefined1)((uint)uVar41 >> 8);
  uVar13 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar93),uVar93);
  sVar56 = CONCAT11((char)uVar41,(char)uVar41);
  uVar48 = CONCAT62(uVar13,sVar56);
  auVar65._8_4_ = 0;
  auVar65._0_8_ = uVar48;
  auVar65._12_2_ = uVar94;
  auVar65._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar64._12_4_ = auVar65._12_4_;
  auVar64._8_2_ = 0;
  auVar64._0_8_ = uVar48;
  auVar64._10_2_ = uVar94;
  auVar63._10_6_ = auVar64._10_6_;
  auVar63._8_2_ = uVar94;
  auVar63._0_8_ = uVar48;
  uVar94 = (undefined2)uVar13;
  auVar16._4_8_ = auVar63._8_8_;
  auVar16._2_2_ = uVar94;
  auVar16._0_2_ = uVar94;
  fVar215 = (float)((int)sVar56 >> 8);
  fVar223 = (float)(auVar16._0_4_ >> 0x18);
  fVar227 = (float)(auVar63._8_4_ >> 0x18);
  uVar41 = *(undefined4 *)(prim + uVar38 * 0xb + 6);
  uVar93 = (undefined1)((uint)uVar41 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar41 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar41));
  uVar93 = (undefined1)((uint)uVar41 >> 8);
  uVar13 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar93),uVar93);
  sVar56 = CONCAT11((char)uVar41,(char)uVar41);
  uVar48 = CONCAT62(uVar13,sVar56);
  auVar68._8_4_ = 0;
  auVar68._0_8_ = uVar48;
  auVar68._12_2_ = uVar94;
  auVar68._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._8_2_ = 0;
  auVar67._0_8_ = uVar48;
  auVar67._10_2_ = uVar94;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._8_2_ = uVar94;
  auVar66._0_8_ = uVar48;
  uVar94 = (undefined2)uVar13;
  auVar17._4_8_ = auVar66._8_8_;
  auVar17._2_2_ = uVar94;
  auVar17._0_2_ = uVar94;
  fVar57 = (float)((int)sVar56 >> 8);
  fVar95 = (float)(auVar17._0_4_ >> 0x18);
  fVar97 = (float)(auVar66._8_4_ >> 0x18);
  uVar41 = *(undefined4 *)(prim + uVar38 * 0xc + 6);
  uVar93 = (undefined1)((uint)uVar41 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar41 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar41));
  uVar93 = (undefined1)((uint)uVar41 >> 8);
  uVar13 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar93),uVar93);
  sVar56 = CONCAT11((char)uVar41,(char)uVar41);
  uVar48 = CONCAT62(uVar13,sVar56);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar48;
  auVar180._12_2_ = uVar94;
  auVar180._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar48;
  auVar179._10_2_ = uVar94;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar94;
  auVar178._0_8_ = uVar48;
  uVar94 = (undefined2)uVar13;
  auVar18._4_8_ = auVar178._8_8_;
  auVar18._2_2_ = uVar94;
  auVar18._0_2_ = uVar94;
  fVar201 = (float)((int)sVar56 >> 8);
  fVar209 = (float)(auVar18._0_4_ >> 0x18);
  fVar211 = (float)(auVar178._8_4_ >> 0x18);
  uVar41 = *(undefined4 *)(prim + uVar38 * 0xd + 6);
  uVar93 = (undefined1)((uint)uVar41 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar41 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar41));
  uVar93 = (undefined1)((uint)uVar41 >> 8);
  uVar13 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar93),uVar93);
  sVar56 = CONCAT11((char)uVar41,(char)uVar41);
  uVar48 = CONCAT62(uVar13,sVar56);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar48;
  auVar183._12_2_ = uVar94;
  auVar183._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar48;
  auVar182._10_2_ = uVar94;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar94;
  auVar181._0_8_ = uVar48;
  uVar94 = (undefined2)uVar13;
  auVar19._4_8_ = auVar181._8_8_;
  auVar19._2_2_ = uVar94;
  auVar19._0_2_ = uVar94;
  fVar241 = (float)((int)sVar56 >> 8);
  fVar243 = (float)(auVar19._0_4_ >> 0x18);
  fVar244 = (float)(auVar181._8_4_ >> 0x18);
  uVar41 = *(undefined4 *)(prim + uVar38 * 0x12 + 6);
  uVar93 = (undefined1)((uint)uVar41 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar41 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar41));
  uVar93 = (undefined1)((uint)uVar41 >> 8);
  uVar13 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar93),uVar93);
  sVar56 = CONCAT11((char)uVar41,(char)uVar41);
  uVar48 = CONCAT62(uVar13,sVar56);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar48;
  auVar186._12_2_ = uVar94;
  auVar186._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar48;
  auVar185._10_2_ = uVar94;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar94;
  auVar184._0_8_ = uVar48;
  uVar94 = (undefined2)uVar13;
  auVar20._4_8_ = auVar184._8_8_;
  auVar20._2_2_ = uVar94;
  auVar20._0_2_ = uVar94;
  fVar234 = (float)((int)sVar56 >> 8);
  fVar239 = (float)(auVar20._0_4_ >> 0x18);
  fVar240 = (float)(auVar184._8_4_ >> 0x18);
  uVar41 = *(undefined4 *)(prim + uVar38 * 0x13 + 6);
  uVar93 = (undefined1)((uint)uVar41 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar41 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar41));
  uVar93 = (undefined1)((uint)uVar41 >> 8);
  uVar13 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar93),uVar93);
  sVar56 = CONCAT11((char)uVar41,(char)uVar41);
  uVar48 = CONCAT62(uVar13,sVar56);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar48;
  auVar189._12_2_ = uVar94;
  auVar189._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar48;
  auVar188._10_2_ = uVar94;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar94;
  auVar187._0_8_ = uVar48;
  uVar94 = (undefined2)uVar13;
  auVar21._4_8_ = auVar187._8_8_;
  auVar21._2_2_ = uVar94;
  auVar21._0_2_ = uVar94;
  fVar245 = (float)((int)sVar56 >> 8);
  fVar246 = (float)(auVar21._0_4_ >> 0x18);
  fVar247 = (float)(auVar187._8_4_ >> 0x18);
  uVar41 = *(undefined4 *)(prim + uVar38 * 0x14 + 6);
  uVar93 = (undefined1)((uint)uVar41 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar41 >> 0x10);
  uVar11 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar41));
  uVar93 = (undefined1)((uint)uVar41 >> 8);
  uVar13 = CONCAT51(CONCAT41((int)((ulong)uVar11 >> 0x20),uVar93),uVar93);
  sVar56 = CONCAT11((char)uVar41,(char)uVar41);
  uVar48 = CONCAT62(uVar13,sVar56);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar48;
  auVar192._12_2_ = uVar94;
  auVar192._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar11 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar48;
  auVar191._10_2_ = uVar94;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar94;
  auVar190._0_8_ = uVar48;
  uVar94 = (undefined2)uVar13;
  auVar22._4_8_ = auVar190._8_8_;
  auVar22._2_2_ = uVar94;
  auVar22._0_2_ = uVar94;
  fVar271 = (float)((int)sVar56 >> 8);
  fVar277 = (float)(auVar22._0_4_ >> 0x18);
  fVar279 = (float)(auVar190._8_4_ >> 0x18);
  fVar261 = fVar130 * fVar99 + fVar140 * fVar161 + fVar141 * fVar215;
  fVar268 = fVar130 * fVar122 + fVar140 * fVar172 + fVar141 * fVar223;
  fVar269 = fVar130 * fVar125 + fVar140 * fVar174 + fVar141 * fVar227;
  fVar270 = fVar130 * (float)(auVar237._12_4_ >> 0x18) +
            fVar140 * (float)(auVar61._12_4_ >> 0x18) + fVar141 * (float)(auVar64._12_4_ >> 0x18);
  fVar248 = fVar130 * fVar57 + fVar140 * fVar201 + fVar141 * fVar241;
  fVar255 = fVar130 * fVar95 + fVar140 * fVar209 + fVar141 * fVar243;
  fVar257 = fVar130 * fVar97 + fVar140 * fVar211 + fVar141 * fVar244;
  fVar259 = fVar130 * (float)(auVar67._12_4_ >> 0x18) +
            fVar140 * (float)(auVar179._12_4_ >> 0x18) + fVar141 * (float)(auVar182._12_4_ >> 0x18);
  fVar177 = fVar130 * fVar234 + fVar140 * fVar245 + fVar141 * fVar271;
  fVar199 = fVar130 * fVar239 + fVar140 * fVar246 + fVar141 * fVar277;
  fVar200 = fVar130 * fVar240 + fVar140 * fVar247 + fVar141 * fVar279;
  fVar130 = fVar130 * (float)(auVar185._12_4_ >> 0x18) +
            fVar140 * (float)(auVar188._12_4_ >> 0x18) + fVar141 * (float)(auVar191._12_4_ >> 0x18);
  fVar161 = fVar99 * fVar142 + fVar161 * fVar156 + fVar215 * fVar158;
  fVar172 = fVar122 * fVar142 + fVar172 * fVar156 + fVar223 * fVar158;
  fVar174 = fVar125 * fVar142 + fVar174 * fVar156 + fVar227 * fVar158;
  fVar215 = (float)(auVar237._12_4_ >> 0x18) * fVar142 +
            (float)(auVar61._12_4_ >> 0x18) * fVar156 + (float)(auVar64._12_4_ >> 0x18) * fVar158;
  fVar227 = fVar57 * fVar142 + fVar201 * fVar156 + fVar241 * fVar158;
  fVar241 = fVar95 * fVar142 + fVar209 * fVar156 + fVar243 * fVar158;
  fVar243 = fVar97 * fVar142 + fVar211 * fVar156 + fVar244 * fVar158;
  fVar244 = (float)(auVar67._12_4_ >> 0x18) * fVar142 +
            (float)(auVar179._12_4_ >> 0x18) * fVar156 + (float)(auVar182._12_4_ >> 0x18) * fVar158;
  fVar201 = fVar142 * fVar234 + fVar156 * fVar245 + fVar158 * fVar271;
  fVar209 = fVar142 * fVar239 + fVar156 * fVar246 + fVar158 * fVar277;
  fVar211 = fVar142 * fVar240 + fVar156 * fVar247 + fVar158 * fVar279;
  fVar223 = fVar142 * (float)(auVar185._12_4_ >> 0x18) +
            fVar156 * (float)(auVar188._12_4_ >> 0x18) + fVar158 * (float)(auVar191._12_4_ >> 0x18);
  fVar141 = (float)DAT_01f4bd50;
  fVar57 = DAT_01f4bd50._4_4_;
  fVar95 = DAT_01f4bd50._8_4_;
  fVar97 = DAT_01f4bd50._12_4_;
  uVar49 = -(uint)(fVar141 <= ABS(fVar261));
  uVar50 = -(uint)(fVar57 <= ABS(fVar268));
  uVar52 = -(uint)(fVar95 <= ABS(fVar269));
  uVar54 = -(uint)(fVar97 <= ABS(fVar270));
  aVar265._0_4_ = (uint)fVar261 & uVar49;
  aVar265._4_4_ = (uint)fVar268 & uVar50;
  aVar265._8_4_ = (uint)fVar269 & uVar52;
  aVar265._12_4_ = (uint)fVar270 & uVar54;
  auVar144._0_4_ = ~uVar49 & (uint)fVar141;
  auVar144._4_4_ = ~uVar50 & (uint)fVar57;
  auVar144._8_4_ = ~uVar52 & (uint)fVar95;
  auVar144._12_4_ = ~uVar54 & (uint)fVar97;
  auVar144 = auVar144 | (undefined1  [16])aVar265;
  uVar49 = -(uint)(fVar141 <= ABS(fVar248));
  uVar50 = -(uint)(fVar57 <= ABS(fVar255));
  uVar52 = -(uint)(fVar95 <= ABS(fVar257));
  uVar54 = -(uint)(fVar97 <= ABS(fVar259));
  aVar252._0_4_ = (uint)fVar248 & uVar49;
  aVar252._4_4_ = (uint)fVar255 & uVar50;
  aVar252._8_4_ = (uint)fVar257 & uVar52;
  aVar252._12_4_ = (uint)fVar259 & uVar54;
  auVar163._0_4_ = ~uVar49 & (uint)fVar141;
  auVar163._4_4_ = ~uVar50 & (uint)fVar57;
  auVar163._8_4_ = ~uVar52 & (uint)fVar95;
  auVar163._12_4_ = ~uVar54 & (uint)fVar97;
  auVar163 = auVar163 | (undefined1  [16])aVar252;
  uVar49 = -(uint)(fVar141 <= ABS(fVar177));
  uVar50 = -(uint)(fVar57 <= ABS(fVar199));
  uVar52 = -(uint)(fVar95 <= ABS(fVar200));
  uVar54 = -(uint)(fVar97 <= ABS(fVar130));
  auVar193._0_4_ = (uint)fVar177 & uVar49;
  auVar193._4_4_ = (uint)fVar199 & uVar50;
  auVar193._8_4_ = (uint)fVar200 & uVar52;
  auVar193._12_4_ = (uint)fVar130 & uVar54;
  auVar235._0_4_ = ~uVar49 & (uint)fVar141;
  auVar235._4_4_ = ~uVar50 & (uint)fVar57;
  auVar235._8_4_ = ~uVar52 & (uint)fVar95;
  auVar235._12_4_ = ~uVar54 & (uint)fVar97;
  auVar235 = auVar235 | auVar193;
  auVar69 = rcpps(_DAT_01f4bd50,auVar144);
  fVar141 = auVar69._0_4_;
  fVar97 = auVar69._4_4_;
  fVar125 = auVar69._8_4_;
  fVar142 = auVar69._12_4_;
  fVar141 = (1.0 - auVar144._0_4_ * fVar141) * fVar141 + fVar141;
  fVar97 = (1.0 - auVar144._4_4_ * fVar97) * fVar97 + fVar97;
  fVar125 = (1.0 - auVar144._8_4_ * fVar125) * fVar125 + fVar125;
  fVar142 = (1.0 - auVar144._12_4_ * fVar142) * fVar142 + fVar142;
  auVar69 = rcpps(auVar69,auVar163);
  fVar57 = auVar69._0_4_;
  fVar99 = auVar69._4_4_;
  fVar130 = auVar69._8_4_;
  fVar156 = auVar69._12_4_;
  fVar57 = (1.0 - auVar163._0_4_ * fVar57) * fVar57 + fVar57;
  fVar99 = (1.0 - auVar163._4_4_ * fVar99) * fVar99 + fVar99;
  fVar130 = (1.0 - auVar163._8_4_ * fVar130) * fVar130 + fVar130;
  fVar156 = (1.0 - auVar163._12_4_ * fVar156) * fVar156 + fVar156;
  auVar69 = rcpps(auVar69,auVar235);
  fVar95 = auVar69._0_4_;
  fVar122 = auVar69._4_4_;
  fVar140 = auVar69._8_4_;
  fVar158 = auVar69._12_4_;
  fVar95 = (1.0 - auVar235._0_4_ * fVar95) * fVar95 + fVar95;
  fVar122 = (1.0 - auVar235._4_4_ * fVar122) * fVar122 + fVar122;
  fVar140 = (1.0 - auVar235._8_4_ * fVar140) * fVar140 + fVar140;
  fVar158 = (1.0 - auVar235._12_4_ * fVar158) * fVar158 + fVar158;
  uVar48 = *(ulong *)(prim + uVar38 * 7 + 6);
  uVar94 = (undefined2)(uVar48 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar48;
  auVar72._12_2_ = uVar94;
  auVar72._14_2_ = uVar94;
  uVar94 = (undefined2)(uVar48 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar48;
  auVar71._10_2_ = uVar94;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar94;
  auVar70._0_8_ = uVar48;
  uVar94 = (undefined2)(uVar48 >> 0x10);
  auVar23._4_8_ = auVar70._8_8_;
  auVar23._2_2_ = uVar94;
  auVar23._0_2_ = uVar94;
  auVar145._0_8_ =
       CONCAT44(((float)(auVar23._0_4_ >> 0x10) - fVar172) * fVar97,
                ((float)(int)(short)uVar48 - fVar161) * fVar141);
  auVar145._8_4_ = ((float)(auVar70._8_4_ >> 0x10) - fVar174) * fVar125;
  auVar145._12_4_ = ((float)(auVar71._12_4_ >> 0x10) - fVar215) * fVar142;
  uVar48 = *(ulong *)(prim + uVar38 * 9 + 6);
  uVar94 = (undefined2)(uVar48 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar48;
  auVar75._12_2_ = uVar94;
  auVar75._14_2_ = uVar94;
  uVar94 = (undefined2)(uVar48 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar48;
  auVar74._10_2_ = uVar94;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar94;
  auVar73._0_8_ = uVar48;
  uVar94 = (undefined2)(uVar48 >> 0x10);
  auVar24._4_8_ = auVar73._8_8_;
  auVar24._2_2_ = uVar94;
  auVar24._0_2_ = uVar94;
  auVar194._0_4_ = ((float)(int)(short)uVar48 - fVar161) * fVar141;
  auVar194._4_4_ = ((float)(auVar24._0_4_ >> 0x10) - fVar172) * fVar97;
  auVar194._8_4_ = ((float)(auVar73._8_4_ >> 0x10) - fVar174) * fVar125;
  auVar194._12_4_ = ((float)(auVar74._12_4_ >> 0x10) - fVar215) * fVar142;
  uVar48 = *(ulong *)(prim + uVar38 * 0xe + 6);
  uVar94 = (undefined2)(uVar48 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar48;
  auVar78._12_2_ = uVar94;
  auVar78._14_2_ = uVar94;
  uVar94 = (undefined2)(uVar48 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar48;
  auVar77._10_2_ = uVar94;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar94;
  auVar76._0_8_ = uVar48;
  uVar94 = (undefined2)(uVar48 >> 0x10);
  auVar25._4_8_ = auVar76._8_8_;
  auVar25._2_2_ = uVar94;
  auVar25._0_2_ = uVar94;
  auVar102._0_8_ =
       CONCAT44(((float)(auVar25._0_4_ >> 0x10) - fVar241) * fVar99,
                ((float)(int)(short)uVar48 - fVar227) * fVar57);
  auVar102._8_4_ = ((float)(auVar76._8_4_ >> 0x10) - fVar243) * fVar130;
  auVar102._12_4_ = ((float)(auVar77._12_4_ >> 0x10) - fVar244) * fVar156;
  uVar48 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar94 = (undefined2)(uVar48 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar48;
  auVar81._12_2_ = uVar94;
  auVar81._14_2_ = uVar94;
  uVar94 = (undefined2)(uVar48 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar48;
  auVar80._10_2_ = uVar94;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar94;
  auVar79._0_8_ = uVar48;
  uVar94 = (undefined2)(uVar48 >> 0x10);
  auVar26._4_8_ = auVar79._8_8_;
  auVar26._2_2_ = uVar94;
  auVar26._0_2_ = uVar94;
  auVar219._0_4_ = ((float)(int)(short)uVar48 - fVar227) * fVar57;
  auVar219._4_4_ = ((float)(auVar26._0_4_ >> 0x10) - fVar241) * fVar99;
  auVar219._8_4_ = ((float)(auVar79._8_4_ >> 0x10) - fVar243) * fVar130;
  auVar219._12_4_ = ((float)(auVar80._12_4_ >> 0x10) - fVar244) * fVar156;
  uVar48 = *(ulong *)(prim + uVar38 * 0x15 + 6);
  uVar94 = (undefined2)(uVar48 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar48;
  auVar84._12_2_ = uVar94;
  auVar84._14_2_ = uVar94;
  uVar94 = (undefined2)(uVar48 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar48;
  auVar83._10_2_ = uVar94;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar94;
  auVar82._0_8_ = uVar48;
  uVar94 = (undefined2)(uVar48 >> 0x10);
  auVar27._4_8_ = auVar82._8_8_;
  auVar27._2_2_ = uVar94;
  auVar27._0_2_ = uVar94;
  auVar85._0_8_ =
       CONCAT44(((float)(auVar27._0_4_ >> 0x10) - fVar209) * fVar122,
                ((float)(int)(short)uVar48 - fVar201) * fVar95);
  auVar85._8_4_ = ((float)(auVar82._8_4_ >> 0x10) - fVar211) * fVar140;
  auVar85._12_4_ = ((float)(auVar83._12_4_ >> 0x10) - fVar223) * fVar158;
  uVar48 = *(ulong *)(prim + uVar38 * 0x17 + 6);
  uVar94 = (undefined2)(uVar48 >> 0x30);
  auVar205._8_4_ = 0;
  auVar205._0_8_ = uVar48;
  auVar205._12_2_ = uVar94;
  auVar205._14_2_ = uVar94;
  uVar94 = (undefined2)(uVar48 >> 0x20);
  auVar204._12_4_ = auVar205._12_4_;
  auVar204._8_2_ = 0;
  auVar204._0_8_ = uVar48;
  auVar204._10_2_ = uVar94;
  auVar203._10_6_ = auVar204._10_6_;
  auVar203._8_2_ = uVar94;
  auVar203._0_8_ = uVar48;
  uVar94 = (undefined2)(uVar48 >> 0x10);
  auVar28._4_8_ = auVar203._8_8_;
  auVar28._2_2_ = uVar94;
  auVar28._0_2_ = uVar94;
  auVar206._0_4_ = ((float)(int)(short)uVar48 - fVar201) * fVar95;
  auVar206._4_4_ = ((float)(auVar28._0_4_ >> 0x10) - fVar209) * fVar122;
  auVar206._8_4_ = ((float)(auVar203._8_4_ >> 0x10) - fVar211) * fVar140;
  auVar206._12_4_ = ((float)(auVar204._12_4_ >> 0x10) - fVar223) * fVar158;
  auVar236._8_4_ = auVar145._8_4_;
  auVar236._0_8_ = auVar145._0_8_;
  auVar236._12_4_ = auVar145._12_4_;
  auVar237 = minps(auVar236,auVar194);
  auVar131._8_4_ = auVar102._8_4_;
  auVar131._0_8_ = auVar102._0_8_;
  auVar131._12_4_ = auVar102._12_4_;
  auVar69 = minps(auVar131,auVar219);
  auVar237 = maxps(auVar237,auVar69);
  auVar132._8_4_ = auVar85._8_4_;
  auVar132._0_8_ = auVar85._0_8_;
  auVar132._12_4_ = auVar85._12_4_;
  auVar69 = minps(auVar132,auVar206);
  uVar41 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar164._4_4_ = uVar41;
  auVar164._0_4_ = uVar41;
  auVar164._8_4_ = uVar41;
  auVar164._12_4_ = uVar41;
  auVar69 = maxps(auVar69,auVar164);
  auVar69 = maxps(auVar237,auVar69);
  fVar57 = auVar69._0_4_ * 0.99999964;
  fVar95 = auVar69._4_4_ * 0.99999964;
  fVar97 = auVar69._8_4_ * 0.99999964;
  fVar99 = auVar69._12_4_ * 0.99999964;
  auVar237 = maxps(auVar145,auVar194);
  auVar69 = maxps(auVar102,auVar219);
  auVar237 = minps(auVar237,auVar69);
  auVar69 = maxps(auVar85,auVar206);
  fVar141 = (ray->super_RayK<1>).tfar;
  auVar103._4_4_ = fVar141;
  auVar103._0_4_ = fVar141;
  auVar103._8_4_ = fVar141;
  auVar103._12_4_ = fVar141;
  auVar69 = minps(auVar69,auVar103);
  auVar69 = minps(auVar237,auVar69);
  auVar104._0_4_ = -(uint)(PVar5 != (Primitive)0x0 && fVar57 <= auVar69._0_4_ * 1.0000004);
  auVar104._4_4_ = -(uint)(1 < (byte)PVar5 && fVar95 <= auVar69._4_4_ * 1.0000004);
  auVar104._8_4_ = -(uint)(2 < (byte)PVar5 && fVar97 <= auVar69._8_4_ * 1.0000004);
  auVar104._12_4_ = -(uint)(3 < (byte)PVar5 && fVar99 <= auVar69._12_4_ * 1.0000004);
  uVar49 = movmskps((uint)(byte)PVar5,auVar104);
  local_3b8 = context;
  local_230 = ray;
  do {
    uVar48 = (ulong)uVar49;
    if (uVar48 == 0) {
      return;
    }
    local_468.v = aVar252.v;
    local_458.v = aVar265.v;
    lVar43 = 0;
    if (uVar48 != 0) {
      for (; (uVar49 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
      }
    }
    uVar48 = uVar48 - 1 & uVar48;
    uVar49 = *(uint *)(prim + 2);
    uVar50 = *(uint *)(prim + lVar43 * 4 + 6);
    local_420 = (ulong)uVar49;
    pGVar7 = (context->scene->geometries).items[uVar49].ptr;
    uVar38 = *(ulong *)&pGVar7->field_0x58;
    _Var8 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    local_3b0 = (ulong)uVar50;
    uVar45 = (ulong)*(uint *)(uVar38 + _Var8 * uVar50);
    pGVar42 = (Geometry *)pGVar7[1].intersectionFilterN;
    lVar43 = *(long *)&pGVar7[1].time_range.upper;
    pfVar1 = (float *)(lVar43 + (long)pGVar42 * uVar45);
    local_388 = *pfVar1;
    fStack_384 = pfVar1[1];
    fStack_380 = pfVar1[2];
    fVar141 = pfVar1[3];
    pfVar2 = (float *)(lVar43 + (uVar45 + 1) * (long)pGVar42);
    fVar122 = *pfVar2;
    fVar125 = pfVar2[1];
    fVar130 = pfVar2[2];
    fVar140 = pfVar2[3];
    pfVar2 = (float *)(lVar43 + (uVar45 + 2) * (long)pGVar42);
    fVar142 = *pfVar2;
    fVar156 = pfVar2[1];
    fVar158 = pfVar2[2];
    fVar161 = pfVar2[3];
    lVar46 = 0;
    if (uVar48 != 0) {
      for (; (uVar48 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
      }
    }
    pfVar2 = (float *)(lVar43 + (uVar45 + 3) * (long)pGVar42);
    fVar172 = *pfVar2;
    fVar174 = pfVar2[1];
    uVar11 = *(undefined8 *)pfVar2;
    pfVar12 = pfVar2 + 2;
    fVar215 = *pfVar12;
    fVar201 = pfVar2[3];
    uVar33 = *(undefined8 *)pfVar12;
    if ((uVar48 != 0) && (uVar45 = uVar48 - 1 & uVar48, uVar45 != 0)) {
      lVar43 = 0;
      if (uVar45 != 0) {
        for (; (uVar45 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
        }
      }
      uVar38 = (ulong)*(uint *)(uVar38 + _Var8 * *(uint *)(prim + lVar43 * 4 + 6));
      pGVar42 = (Geometry *)((long)pGVar42 * uVar38);
    }
    iVar6 = (int)pGVar7[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    fVar209 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar211 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar223 = (ray->super_RayK<1>).org.field_0.m128[2];
    local_1e8 = (ray->super_RayK<1>).org.field_0.m128[3];
    fStack_37c = fVar141;
    fVar244 = local_388 - fVar209;
    fVar245 = fStack_384 - fVar211;
    fVar246 = fStack_380 - fVar223;
    fVar177 = (pre->ray_space).vx.field_0.m128[0];
    fVar199 = (pre->ray_space).vx.field_0.m128[1];
    fVar200 = (pre->ray_space).vx.field_0.m128[2];
    fVar227 = (pre->ray_space).vy.field_0.m128[0];
    fVar234 = (pre->ray_space).vy.field_0.m128[1];
    fVar239 = (pre->ray_space).vy.field_0.m128[2];
    fVar240 = (pre->ray_space).vz.field_0.m128[0];
    fVar241 = (pre->ray_space).vz.field_0.m128[1];
    fVar243 = (pre->ray_space).vz.field_0.m128[2];
    local_188 = fVar244 * fVar177 + fVar245 * fVar227 + fVar246 * fVar240;
    local_1f8 = fVar244 * fVar199 + fVar245 * fVar234 + fVar246 * fVar241;
    local_3c8 = fVar244 * fVar200 + fVar245 * fVar239 + fVar246 * fVar243;
    fVar244 = fVar122 - fVar209;
    fVar245 = fVar125 - fVar211;
    fVar246 = fVar130 - fVar223;
    local_448 = fVar244 * fVar177 + fVar245 * fVar227 + fVar246 * fVar240;
    local_218 = fVar244 * fVar199 + fVar245 * fVar234 + fVar246 * fVar241;
    fVar247 = fVar244 * fVar200 + fVar245 * fVar239 + fVar246 * fVar243;
    fVar244 = fVar142 - fVar209;
    fVar245 = fVar156 - fVar211;
    fVar246 = fVar158 - fVar223;
    fVar248 = fVar244 * fVar177 + fVar245 * fVar227 + fVar246 * fVar240;
    fVar255 = fVar244 * fVar199 + fVar245 * fVar234 + fVar246 * fVar241;
    local_1d8 = fVar244 * fVar200 + fVar245 * fVar239 + fVar246 * fVar243;
    fVar209 = fVar172 - fVar209;
    fVar211 = fVar174 - fVar211;
    fVar223 = fVar215 - fVar223;
    fVar177 = fVar209 * fVar177 + fVar211 * fVar227 + fVar223 * fVar240;
    local_478 = fVar209 * fVar199 + fVar211 * fVar234 + fVar223 * fVar241;
    fVar211 = fVar209 * fVar200 + fVar211 * fVar239 + fVar223 * fVar243;
    auVar220._0_8_ = CONCAT44(local_1f8,local_188) & 0x7fffffff7fffffff;
    auVar220._8_4_ = ABS(local_3c8);
    auVar220._12_4_ = ABS(fVar141);
    auVar146._0_8_ = CONCAT44(local_218,local_448) & 0x7fffffff7fffffff;
    auVar146._8_4_ = ABS(fVar247);
    auVar146._12_4_ = ABS(fVar140);
    auVar237 = maxps(auVar220,auVar146);
    auVar165._0_8_ = CONCAT44(fVar255,fVar248) & 0x7fffffff7fffffff;
    auVar165._8_4_ = ABS(local_1d8);
    auVar165._12_4_ = ABS(fVar161);
    auVar105._0_8_ = CONCAT44(local_478,fVar177) & 0x7fffffff7fffffff;
    auVar105._8_4_ = ABS(fVar211);
    auVar105._12_4_ = ABS(fVar201);
    auVar69 = maxps(auVar165,auVar105);
    auVar69 = maxps(auVar237,auVar69);
    fStack_224 = auVar69._4_4_;
    uVar98 = auVar69._8_8_;
    fVar209 = fStack_224;
    if (fStack_224 <= auVar69._0_4_) {
      fVar209 = auVar69._0_4_;
    }
    auVar221._8_8_ = uVar98;
    auVar221._0_8_ = uVar98;
    if (auVar69._8_4_ <= fVar209) {
      auVar222._4_12_ = auVar221._4_12_;
      auVar222._0_4_ = fVar209;
      uVar98 = auVar222._0_8_;
    }
    local_228 = (float)iVar6;
    fStack_220 = fStack_224;
    fStack_21c = fStack_224;
    lVar43 = (long)iVar6;
    lVar46 = lVar43 * 0x44;
    fVar209 = *(float *)(catmullrom_basis0 + lVar46 + 0x908);
    fVar223 = *(float *)(catmullrom_basis0 + lVar46 + 0x90c);
    fVar199 = *(float *)(catmullrom_basis0 + lVar46 + 0x910);
    fVar200 = *(float *)(catmullrom_basis0 + lVar46 + 0x914);
    fVar227 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar46 + 0xd8c);
    fVar234 = *(float *)(catmullrom_basis0 + lVar46 + 0xd90);
    fVar239 = *(float *)(catmullrom_basis0 + lVar46 + 0xd94);
    auVar14 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar46 + 0xd8c);
    fVar240 = *(float *)(catmullrom_basis0 + lVar46 + 0xd98);
    fStack_474 = local_478;
    fStack_470 = local_478;
    fStack_46c = local_478;
    local_408 = fVar142;
    fStack_404 = fVar156;
    fStack_400 = fVar158;
    fStack_3fc = fVar161;
    fVar241 = *(float *)(catmullrom_basis0 + lVar46 + 0x484);
    fVar243 = *(float *)(catmullrom_basis0 + lVar46 + 0x488);
    fVar244 = *(float *)(catmullrom_basis0 + lVar46 + 0x48c);
    fVar245 = *(float *)(catmullrom_basis0 + lVar46 + 0x490);
    local_3f8 = fVar122;
    fStack_3f4 = fVar125;
    fStack_3f0 = fVar130;
    fStack_3ec = fVar140;
    fVar246 = *(float *)(catmullrom_basis0 + lVar46);
    fVar257 = *(float *)(catmullrom_basis0 + lVar46 + 4);
    fVar259 = *(float *)(catmullrom_basis0 + lVar46 + 8);
    fVar261 = *(float *)(catmullrom_basis0 + lVar46 + 0xc);
    fVar143 = local_188 * fVar246 + local_448 * fVar241 + fVar248 * fVar209 + fVar177 * fVar227;
    fVar157 = local_188 * fVar257 + local_448 * fVar243 + fVar248 * fVar223 + fVar177 * fVar234;
    fVar159 = local_188 * fVar259 + local_448 * fVar244 + fVar248 * fVar199 + fVar177 * fVar239;
    fVar160 = local_188 * fVar261 + local_448 * fVar245 + fVar248 * fVar200 + fVar177 * fVar240;
    local_198 = local_1f8 * fVar246 + local_218 * fVar241 + fVar255 * fVar209 + local_478 * fVar227;
    fStack_194 = local_1f8 * fVar257 + local_218 * fVar243 + fVar255 * fVar223 + local_478 * fVar234
    ;
    fStack_190 = local_1f8 * fVar259 + local_218 * fVar244 + fVar255 * fVar199 + local_478 * fVar239
    ;
    fStack_18c = local_1f8 * fVar261 + local_218 * fVar245 + fVar255 * fVar200 + local_478 * fVar240
    ;
    local_208._0_4_ = fVar141 * fVar246 + fVar140 * fVar241 + fVar161 * fVar209 + fVar201 * fVar227;
    local_208._4_4_ = fVar141 * fVar257 + fVar140 * fVar243 + fVar161 * fVar223 + fVar201 * fVar234;
    fStack_200 = fVar141 * fVar259 + fVar140 * fVar244 + fVar161 * fVar199 + fVar201 * fVar239;
    fStack_1fc = fVar141 * fVar261 + fVar140 * fVar245 + fVar161 * fVar200 + fVar201 * fVar240;
    fVar227 = *(float *)(catmullrom_basis1 + lVar46 + 0xd8c);
    fVar234 = *(float *)(catmullrom_basis1 + lVar46 + 0xd90);
    fVar239 = *(float *)(catmullrom_basis1 + lVar46 + 0xd94);
    fVar268 = *(float *)(catmullrom_basis1 + lVar46 + 0xd98);
    fVar269 = *(float *)(catmullrom_basis1 + lVar46 + 0x908);
    fVar270 = *(float *)(catmullrom_basis1 + lVar46 + 0x90c);
    fVar271 = *(float *)(catmullrom_basis1 + lVar46 + 0x910);
    fVar277 = *(float *)(catmullrom_basis1 + lVar46 + 0x914);
    fVar279 = *(float *)(catmullrom_basis1 + lVar46 + 0x484);
    fVar290 = *(float *)(catmullrom_basis1 + lVar46 + 0x488);
    fVar293 = *(float *)(catmullrom_basis1 + lVar46 + 0x48c);
    fVar272 = *(float *)(catmullrom_basis1 + lVar46 + 0x490);
    fStack_444 = local_448;
    fStack_440 = local_448;
    fStack_43c = local_448;
    fStack_214 = local_218;
    fStack_210 = local_218;
    fStack_20c = local_218;
    fVar278 = *(float *)(catmullrom_basis1 + lVar46);
    fVar280 = *(float *)(catmullrom_basis1 + lVar46 + 4);
    fVar281 = *(float *)(catmullrom_basis1 + lVar46 + 8);
    fVar250 = *(float *)(catmullrom_basis1 + lVar46 + 0xc);
    fStack_184 = local_188;
    fStack_180 = local_188;
    fStack_17c = local_188;
    fVar216 = local_188 * fVar278 + local_448 * fVar279 + fVar248 * fVar269 + fVar177 * fVar227;
    fVar224 = local_188 * fVar280 + local_448 * fVar290 + fVar248 * fVar270 + fVar177 * fVar234;
    fVar228 = local_188 * fVar281 + local_448 * fVar293 + fVar248 * fVar271 + fVar177 * fVar239;
    fVar231 = local_188 * fVar250 + local_448 * fVar272 + fVar248 * fVar277 + fVar177 * fVar268;
    fStack_1f4 = local_1f8;
    fStack_1f0 = local_1f8;
    fStack_1ec = local_1f8;
    fVar202 = local_1f8 * fVar278 + local_218 * fVar279 + fVar255 * fVar269 + local_478 * fVar227;
    fVar210 = local_1f8 * fVar280 + local_218 * fVar290 + fVar255 * fVar270 + local_478 * fVar234;
    fVar212 = local_1f8 * fVar281 + local_218 * fVar293 + fVar255 * fVar271 + local_478 * fVar239;
    fVar213 = local_1f8 * fVar250 + local_218 * fVar272 + fVar255 * fVar277 + local_478 * fVar268;
    auVar262._0_4_ = fVar141 * fVar278 + fVar140 * fVar279 + fVar161 * fVar269 + fVar201 * fVar227;
    auVar262._4_4_ = fVar141 * fVar280 + fVar140 * fVar290 + fVar161 * fVar270 + fVar201 * fVar234;
    auVar262._8_4_ = fVar141 * fVar281 + fVar140 * fVar293 + fVar161 * fVar271 + fVar201 * fVar239;
    auVar262._12_4_ = fVar141 * fVar250 + fVar140 * fVar272 + fVar161 * fVar277 + fVar201 * fVar268;
    fVar217 = fVar216 - fVar143;
    fVar225 = fVar224 - fVar157;
    fVar229 = fVar228 - fVar159;
    fVar232 = fVar231 - fVar160;
    fVar162 = fVar202 - local_198;
    fVar173 = fVar210 - fStack_194;
    fVar175 = fVar212 - fStack_190;
    fVar176 = fVar213 - fStack_18c;
    fVar284 = local_198 * fVar217 - fVar143 * fVar162;
    fVar286 = fStack_194 * fVar225 - fVar157 * fVar173;
    fVar288 = fStack_190 * fVar229 - fVar159 * fVar175;
    fVar291 = fStack_18c * fVar232 - fVar160 * fVar176;
    auVar69 = maxps(_local_208,auVar262);
    bVar31 = fVar284 * fVar284 <=
             auVar69._0_4_ * auVar69._0_4_ * (fVar217 * fVar217 + fVar162 * fVar162) &&
             0.0 < local_228;
    bVar32 = fVar286 * fVar286 <=
             auVar69._4_4_ * auVar69._4_4_ * (fVar225 * fVar225 + fVar173 * fVar173) &&
             1.0 < local_228;
    bVar30 = fVar288 * fVar288 <=
             auVar69._8_4_ * auVar69._8_4_ * (fVar229 * fVar229 + fVar175 * fVar175) &&
             2.0 < local_228;
    bVar29 = fVar291 * fVar291 <=
             auVar69._12_4_ * auVar69._12_4_ * (fVar232 * fVar232 + fVar176 * fVar176) &&
             3.0 < local_228;
    local_2e8 = (float)uVar98;
    local_2e8 = local_2e8 * 4.7683716e-07;
    auVar10._4_4_ = -(uint)bVar32;
    auVar10._0_4_ = -(uint)bVar31;
    auVar10._8_4_ = -(uint)bVar30;
    auVar10._12_4_ = -(uint)bVar29;
    uVar52 = movmskps((int)uVar38,auVar10);
    puVar39 = (undefined1 *)(ulong)uVar52;
    fStack_1e4 = local_1e8;
    fStack_1e0 = local_1e8;
    fStack_1dc = local_1e8;
    fStack_3c4 = local_3c8;
    fStack_3c0 = local_3c8;
    fStack_3bc = local_3c8;
    fStack_1d4 = local_1d8;
    fStack_1d0 = local_1d8;
    fStack_1cc = local_1d8;
    fVar284 = fVar211;
    fVar286 = fVar211;
    fVar288 = fVar211;
    if (uVar52 != 0) {
      fVar58 = fVar227 * fVar211 + fVar269 * local_1d8 + fVar279 * fVar247 + fVar278 * local_3c8;
      fVar96 = fVar234 * fVar211 + fVar270 * local_1d8 + fVar290 * fVar247 + fVar280 * local_3c8;
      fStack_430 = fVar239 * fVar211 + fVar271 * local_1d8 + fVar293 * fVar247 + fVar281 * local_3c8
      ;
      fStack_42c = fVar268 * fVar211 + fVar277 * local_1d8 + fVar272 * fVar247 + fVar250 * local_3c8
      ;
      local_438 = CONCAT44(fVar96,fVar58);
      local_498._0_4_ = auVar14._0_4_;
      local_498._4_4_ = auVar14._4_4_;
      fStack_490 = auVar14._8_4_;
      fVar100 = (float)local_498._0_4_ * fVar211 + fVar209 * local_1d8 + fVar241 * fVar247 +
                fVar246 * local_3c8;
      fVar123 = (float)local_498._4_4_ * fVar211 + fVar223 * local_1d8 + fVar243 * fVar247 +
                fVar257 * local_3c8;
      fVar126 = fStack_490 * fVar211 + fVar199 * local_1d8 + fVar244 * fVar247 + fVar259 * local_3c8
      ;
      fVar128 = fVar240 * fVar211 + fVar200 * local_1d8 + fVar245 * fVar247 + fVar261 * local_3c8;
      fVar209 = *(float *)(catmullrom_basis0 + lVar46 + 0x1210);
      fVar223 = *(float *)(catmullrom_basis0 + lVar46 + 0x1214);
      fVar199 = *(float *)(catmullrom_basis0 + lVar46 + 0x1218);
      fVar200 = *(float *)(catmullrom_basis0 + lVar46 + 0x121c);
      fVar227 = *(float *)(catmullrom_basis0 + lVar46 + 0x1694);
      fVar234 = *(float *)(catmullrom_basis0 + lVar46 + 0x1698);
      fVar239 = *(float *)(catmullrom_basis0 + lVar46 + 0x169c);
      fVar240 = *(float *)(catmullrom_basis0 + lVar46 + 0x16a0);
      fVar241 = *(float *)(catmullrom_basis0 + lVar46 + 0x1b18);
      fVar243 = *(float *)(catmullrom_basis0 + lVar46 + 0x1b1c);
      fVar244 = *(float *)(catmullrom_basis0 + lVar46 + 0x1b20);
      fVar245 = *(float *)(catmullrom_basis0 + lVar46 + 0x1b24);
      fVar246 = *(float *)(catmullrom_basis0 + lVar46 + 0x1f9c);
      fVar257 = *(float *)(catmullrom_basis0 + lVar46 + 0x1fa0);
      fVar259 = *(float *)(catmullrom_basis0 + lVar46 + 0x1fa4);
      fVar261 = *(float *)(catmullrom_basis0 + lVar46 + 0x1fa8);
      local_3d8 = fVar211;
      fStack_3d4 = fVar211;
      fStack_3d0 = fVar211;
      fStack_3cc = fVar211;
      fVar249 = local_188 * fVar209 + local_448 * fVar227 + fVar248 * fVar241 + fVar177 * fVar246;
      fVar256 = local_188 * fVar223 + local_448 * fVar234 + fVar248 * fVar243 + fVar177 * fVar257;
      fVar258 = local_188 * fVar199 + local_448 * fVar239 + fVar248 * fVar244 + fVar177 * fVar259;
      fVar260 = local_188 * fVar200 + local_448 * fVar240 + fVar248 * fVar245 + fVar177 * fVar261;
      fVar285 = local_1f8 * fVar209 + local_218 * fVar227 + fVar255 * fVar241 + local_478 * fVar246;
      fVar287 = local_1f8 * fVar223 + local_218 * fVar234 + fVar255 * fVar243 + local_478 * fVar257;
      fVar289 = local_1f8 * fVar199 + local_218 * fVar239 + fVar255 * fVar244 + local_478 * fVar259;
      fVar292 = local_1f8 * fVar200 + local_218 * fVar240 + fVar255 * fVar245 + local_478 * fVar261;
      fVar268 = *(float *)(catmullrom_basis1 + lVar46 + 0x1210);
      fVar269 = *(float *)(catmullrom_basis1 + lVar46 + 0x1214);
      fVar270 = *(float *)(catmullrom_basis1 + lVar46 + 0x1218);
      fVar271 = *(float *)(catmullrom_basis1 + lVar46 + 0x121c);
      fVar277 = *(float *)(catmullrom_basis1 + lVar46 + 0x1b18);
      fVar279 = *(float *)(catmullrom_basis1 + lVar46 + 0x1b1c);
      fVar290 = *(float *)(catmullrom_basis1 + lVar46 + 0x1b20);
      fVar293 = *(float *)(catmullrom_basis1 + lVar46 + 0x1b24);
      fVar272 = *(float *)(catmullrom_basis1 + lVar46 + 0x1f9c);
      fVar278 = *(float *)(catmullrom_basis1 + lVar46 + 0x1fa0);
      fVar280 = *(float *)(catmullrom_basis1 + lVar46 + 0x1fa4);
      fVar281 = *(float *)(catmullrom_basis1 + lVar46 + 0x1fa8);
      auVar166._0_4_ = fVar177 * fVar272;
      auVar166._4_4_ = fVar177 * fVar278;
      auVar166._8_4_ = fVar177 * fVar280;
      auVar166._12_4_ = fVar177 * fVar281;
      fVar250 = *(float *)(catmullrom_basis1 + lVar46 + 0x1694);
      fVar291 = *(float *)(catmullrom_basis1 + lVar46 + 0x1698);
      fVar214 = *(float *)(catmullrom_basis1 + lVar46 + 0x169c);
      fVar251 = *(float *)(catmullrom_basis1 + lVar46 + 0x16a0);
      fVar218 = local_188 * fVar268 + local_448 * fVar250 + fVar248 * fVar277 + auVar166._0_4_;
      fVar226 = local_188 * fVar269 + local_448 * fVar291 + fVar248 * fVar279 + auVar166._4_4_;
      fVar230 = local_188 * fVar270 + local_448 * fVar214 + fVar248 * fVar290 + auVar166._8_4_;
      fVar233 = local_188 * fVar271 + local_448 * fVar251 + fVar248 * fVar293 + auVar166._12_4_;
      fVar101 = local_1f8 * fVar268 + local_218 * fVar250 + fVar255 * fVar277 + local_478 * fVar272;
      fVar124 = local_1f8 * fVar269 + local_218 * fVar291 + fVar255 * fVar279 + local_478 * fVar278;
      fVar127 = local_1f8 * fVar270 + local_218 * fVar214 + fVar255 * fVar290 + local_478 * fVar280;
      fVar129 = local_1f8 * fVar271 + local_218 * fVar251 + fVar255 * fVar293 + local_478 * fVar281;
      auVar263._0_8_ = CONCAT44(fVar256,fVar249) & 0x7fffffff7fffffff;
      auVar263._8_4_ = ABS(fVar258);
      auVar263._12_4_ = ABS(fVar260);
      auVar238._0_8_ = CONCAT44(fVar287,fVar285) & 0x7fffffff7fffffff;
      auVar238._8_4_ = ABS(fVar289);
      auVar238._12_4_ = ABS(fVar292);
      auVar69 = maxps(auVar263,auVar238);
      auVar273._0_8_ =
           CONCAT44(fVar223 * local_3c8 +
                    fVar234 * fVar247 + fVar243 * local_1d8 + fVar257 * fVar211,
                    fVar209 * local_3c8 +
                    fVar227 * fVar247 + fVar241 * local_1d8 + fVar246 * fVar211) &
           0x7fffffff7fffffff;
      auVar273._8_4_ =
           ABS(fVar199 * local_3c8 + fVar239 * fVar247 + fVar244 * local_1d8 + fVar259 * fVar211);
      auVar273._12_4_ =
           ABS(fVar200 * local_3c8 + fVar240 * fVar247 + fVar245 * local_1d8 + fVar261 * fVar211);
      auVar69 = maxps(auVar69,auVar273);
      uVar54 = -(uint)(local_2e8 <= auVar69._0_4_);
      uVar51 = -(uint)(local_2e8 <= auVar69._4_4_);
      uVar53 = -(uint)(local_2e8 <= auVar69._8_4_);
      uVar55 = -(uint)(local_2e8 <= auVar69._12_4_);
      fVar227 = (float)((uint)fVar249 & uVar54 | ~uVar54 & (uint)fVar217);
      fVar234 = (float)((uint)fVar256 & uVar51 | ~uVar51 & (uint)fVar225);
      fVar239 = (float)((uint)fVar258 & uVar53 | ~uVar53 & (uint)fVar229);
      fVar240 = (float)((uint)fVar260 & uVar55 | ~uVar55 & (uint)fVar232);
      fVar246 = (float)(~uVar54 & (uint)fVar162 | (uint)fVar285 & uVar54);
      fVar257 = (float)(~uVar51 & (uint)fVar173 | (uint)fVar287 & uVar51);
      fVar259 = (float)(~uVar53 & (uint)fVar175 | (uint)fVar289 & uVar53);
      fVar261 = (float)(~uVar55 & (uint)fVar176 | (uint)fVar292 & uVar55);
      auVar274._0_8_ = CONCAT44(fVar226,fVar218) & 0x7fffffff7fffffff;
      auVar274._8_4_ = ABS(fVar230);
      auVar274._12_4_ = ABS(fVar233);
      auVar242._0_8_ = CONCAT44(fVar124,fVar101) & 0x7fffffff7fffffff;
      auVar242._8_4_ = ABS(fVar127);
      auVar242._12_4_ = ABS(fVar129);
      auVar69 = maxps(auVar274,auVar242);
      auVar207._0_8_ =
           CONCAT44(fVar269 * local_3c8 +
                    fVar291 * fVar247 + fVar279 * local_1d8 + fVar278 * fVar211,
                    fVar268 * local_3c8 +
                    fVar250 * fVar247 + fVar277 * local_1d8 + fVar272 * fVar211) &
           0x7fffffff7fffffff;
      auVar207._8_4_ =
           ABS(fVar270 * local_3c8 + fVar214 * fVar247 + fVar290 * local_1d8 + fVar280 * fVar211);
      auVar207._12_4_ =
           ABS(fVar271 * local_3c8 + fVar251 * fVar247 + fVar293 * local_1d8 + fVar281 * fVar211);
      auVar69 = maxps(auVar69,auVar207);
      uVar54 = -(uint)(local_2e8 <= auVar69._0_4_);
      uVar51 = -(uint)(local_2e8 <= auVar69._4_4_);
      uVar53 = -(uint)(local_2e8 <= auVar69._8_4_);
      uVar55 = -(uint)(local_2e8 <= auVar69._12_4_);
      fVar241 = (float)((uint)fVar218 & uVar54 | ~uVar54 & (uint)fVar217);
      fVar243 = (float)((uint)fVar226 & uVar51 | ~uVar51 & (uint)fVar225);
      fVar244 = (float)((uint)fVar230 & uVar53 | ~uVar53 & (uint)fVar229);
      fVar245 = (float)((uint)fVar233 & uVar55 | ~uVar55 & (uint)fVar232);
      fVar268 = (float)(~uVar54 & (uint)fVar162 | (uint)fVar101 & uVar54);
      fVar269 = (float)(~uVar51 & (uint)fVar173 | (uint)fVar124 & uVar51);
      fVar270 = (float)(~uVar53 & (uint)fVar175 | (uint)fVar127 & uVar53);
      fVar271 = (float)(~uVar55 & (uint)fVar176 | (uint)fVar129 & uVar55);
      auVar106._0_4_ = fVar246 * fVar246 + fVar227 * fVar227;
      auVar106._4_4_ = fVar257 * fVar257 + fVar234 * fVar234;
      auVar106._8_4_ = fVar259 * fVar259 + fVar239 * fVar239;
      auVar106._12_4_ = fVar261 * fVar261 + fVar240 * fVar240;
      auVar69 = rsqrtps(auVar166,auVar106);
      fVar209 = auVar69._0_4_;
      fVar223 = auVar69._4_4_;
      fVar199 = auVar69._8_4_;
      fVar200 = auVar69._12_4_;
      auVar167._0_4_ = fVar209 * fVar209 * auVar106._0_4_ * 0.5 * fVar209;
      auVar167._4_4_ = fVar223 * fVar223 * auVar106._4_4_ * 0.5 * fVar223;
      auVar167._8_4_ = fVar199 * fVar199 * auVar106._8_4_ * 0.5 * fVar199;
      auVar167._12_4_ = fVar200 * fVar200 * auVar106._12_4_ * 0.5 * fVar200;
      fVar277 = fVar209 * 1.5 - auVar167._0_4_;
      fVar279 = fVar223 * 1.5 - auVar167._4_4_;
      fVar290 = fVar199 * 1.5 - auVar167._8_4_;
      fVar293 = fVar200 * 1.5 - auVar167._12_4_;
      auVar107._0_4_ = fVar268 * fVar268 + fVar241 * fVar241;
      auVar107._4_4_ = fVar269 * fVar269 + fVar243 * fVar243;
      auVar107._8_4_ = fVar270 * fVar270 + fVar244 * fVar244;
      auVar107._12_4_ = fVar271 * fVar271 + fVar245 * fVar245;
      auVar69 = rsqrtps(auVar167,auVar107);
      fVar209 = auVar69._0_4_;
      fVar223 = auVar69._4_4_;
      fVar199 = auVar69._8_4_;
      fVar200 = auVar69._12_4_;
      fVar209 = fVar209 * 1.5 - fVar209 * fVar209 * auVar107._0_4_ * 0.5 * fVar209;
      fVar223 = fVar223 * 1.5 - fVar223 * fVar223 * auVar107._4_4_ * 0.5 * fVar223;
      fVar199 = fVar199 * 1.5 - fVar199 * fVar199 * auVar107._8_4_ * 0.5 * fVar199;
      fVar200 = fVar200 * 1.5 - fVar200 * fVar200 * auVar107._12_4_ * 0.5 * fVar200;
      fVar246 = fVar246 * fVar277 * (float)local_208._0_4_;
      fVar257 = fVar257 * fVar279 * (float)local_208._4_4_;
      fVar259 = fVar259 * fVar290 * fStack_200;
      fVar261 = fVar261 * fVar293 * fStack_1fc;
      local_1b8._0_4_ = fVar143 + fVar246;
      local_1b8._4_4_ = fVar157 + fVar257;
      fStack_1b0 = fVar159 + fVar259;
      fStack_1ac = fVar160 + fVar261;
      fVar227 = -fVar227 * fVar277 * (float)local_208._0_4_;
      fVar234 = -fVar234 * fVar279 * (float)local_208._4_4_;
      fVar239 = -fVar239 * fVar290 * fStack_200;
      fVar240 = -fVar240 * fVar293 * fStack_1fc;
      local_3a8 = local_198 + fVar227;
      fStack_3a4 = fStack_194 + fVar234;
      fStack_3a0 = fStack_190 + fVar239;
      fStack_39c = fStack_18c + fVar240;
      fVar176 = fVar277 * 0.0 * (float)local_208._0_4_;
      fVar217 = fVar279 * 0.0 * (float)local_208._4_4_;
      fVar225 = fVar290 * 0.0 * fStack_200;
      fVar229 = fVar293 * 0.0 * fStack_1fc;
      local_398 = fVar100 + fVar176;
      fStack_394 = fVar123 + fVar217;
      fStack_390 = fVar126 + fVar225;
      fStack_38c = fVar128 + fVar229;
      fVar272 = fVar268 * fVar209 * auVar262._0_4_;
      fVar278 = fVar269 * fVar223 * auVar262._4_4_;
      fVar280 = fVar270 * fVar199 * auVar262._8_4_;
      fVar281 = fVar271 * fVar200 * auVar262._12_4_;
      fVar268 = fVar216 + fVar272;
      fVar269 = fVar224 + fVar278;
      fVar270 = fVar228 + fVar280;
      fVar271 = fVar231 + fVar281;
      fVar241 = -fVar241 * fVar209 * auVar262._0_4_;
      fVar243 = -fVar243 * fVar223 * auVar262._4_4_;
      fVar244 = -fVar244 * fVar199 * auVar262._8_4_;
      fVar245 = -fVar245 * fVar200 * auVar262._12_4_;
      fVar250 = fVar202 + fVar241;
      fVar162 = fVar210 + fVar243;
      fVar173 = fVar212 + fVar244;
      fVar175 = fVar213 + fVar245;
      fVar209 = fVar209 * 0.0 * auVar262._0_4_;
      fVar223 = fVar223 * 0.0 * auVar262._4_4_;
      fVar199 = fVar199 * 0.0 * auVar262._8_4_;
      fVar200 = fVar200 * 0.0 * auVar262._12_4_;
      fVar143 = fVar143 - fVar246;
      fVar157 = fVar157 - fVar257;
      fVar159 = fVar159 - fVar259;
      fVar160 = fVar160 - fVar261;
      fVar277 = fVar58 + fVar209;
      fVar279 = fVar96 + fVar223;
      fVar290 = fStack_430 + fVar199;
      fVar293 = fStack_42c + fVar200;
      fVar227 = local_198 - fVar227;
      fVar234 = fStack_194 - fVar234;
      fVar239 = fStack_190 - fVar239;
      fVar240 = fStack_18c - fVar240;
      fVar100 = fVar100 - fVar176;
      fVar123 = fVar123 - fVar217;
      fVar126 = fVar126 - fVar225;
      fVar128 = fVar128 - fVar229;
      uVar54 = -(uint)(0.0 < (fVar227 * (fVar277 - fVar100) - fVar100 * (fVar250 - fVar227)) * 0.0 +
                             (fVar100 * (fVar268 - fVar143) - (fVar277 - fVar100) * fVar143) * 0.0 +
                             ((fVar250 - fVar227) * fVar143 - (fVar268 - fVar143) * fVar227));
      uVar51 = -(uint)(0.0 < (fVar234 * (fVar279 - fVar123) - fVar123 * (fVar162 - fVar234)) * 0.0 +
                             (fVar123 * (fVar269 - fVar157) - (fVar279 - fVar123) * fVar157) * 0.0 +
                             ((fVar162 - fVar234) * fVar157 - (fVar269 - fVar157) * fVar234));
      uVar53 = -(uint)(0.0 < (fVar239 * (fVar290 - fVar126) - fVar126 * (fVar173 - fVar239)) * 0.0 +
                             (fVar126 * (fVar270 - fVar159) - (fVar290 - fVar126) * fVar159) * 0.0 +
                             ((fVar173 - fVar239) * fVar159 - (fVar270 - fVar159) * fVar239));
      uVar55 = -(uint)(0.0 < (fVar240 * (fVar293 - fVar128) - fVar128 * (fVar175 - fVar240)) * 0.0 +
                             (fVar128 * (fVar271 - fVar160) - (fVar293 - fVar128) * fVar160) * 0.0 +
                             ((fVar175 - fVar240) * fVar160 - (fVar271 - fVar160) * fVar240));
      local_3e8 = (undefined1  [4])((uint)(fVar216 - fVar272) & uVar54 | ~uVar54 & local_1b8._0_4_);
      auStack_3e4._0_4_ = (uint)(fVar224 - fVar278) & uVar51 | ~uVar51 & local_1b8._4_4_;
      auStack_3e4._4_4_ = (uint)(fVar228 - fVar280) & uVar53 | ~uVar53 & (uint)fStack_1b0;
      fStack_3dc = (float)((uint)(fVar231 - fVar281) & uVar55 | ~uVar55 & (uint)fStack_1ac);
      fVar246 = (float)((uint)(fVar202 - fVar241) & uVar54 | ~uVar54 & (uint)local_3a8);
      fVar257 = (float)((uint)(fVar210 - fVar243) & uVar51 | ~uVar51 & (uint)fStack_3a4);
      fVar259 = (float)((uint)(fVar212 - fVar244) & uVar53 | ~uVar53 & (uint)fStack_3a0);
      fVar261 = (float)((uint)(fVar213 - fVar245) & uVar55 | ~uVar55 & (uint)fStack_39c);
      fVar272 = (float)((uint)(fVar58 - fVar209) & uVar54 | ~uVar54 & (uint)local_398);
      fVar278 = (float)((uint)(fVar96 - fVar223) & uVar51 | ~uVar51 & (uint)fStack_394);
      fVar280 = (float)((uint)(fStack_430 - fVar199) & uVar53 | ~uVar53 & (uint)fStack_390);
      fVar281 = (float)((uint)(fStack_42c - fVar200) & uVar55 | ~uVar55 & (uint)fStack_38c);
      fVar209 = (float)((uint)fVar143 & uVar54 | ~uVar54 & (uint)fVar268);
      fVar223 = (float)((uint)fVar157 & uVar51 | ~uVar51 & (uint)fVar269);
      fVar199 = (float)((uint)fVar159 & uVar53 | ~uVar53 & (uint)fVar270);
      fVar200 = (float)((uint)fVar160 & uVar55 | ~uVar55 & (uint)fVar271);
      fVar241 = (float)((uint)fVar227 & uVar54 | ~uVar54 & (uint)fVar250);
      fVar243 = (float)((uint)fVar234 & uVar51 | ~uVar51 & (uint)fVar162);
      fVar244 = (float)((uint)fVar239 & uVar53 | ~uVar53 & (uint)fVar173);
      fVar245 = (float)((uint)fVar240 & uVar55 | ~uVar55 & (uint)fVar175);
      fVar176 = (float)((uint)fVar100 & uVar54 | ~uVar54 & (uint)fVar277);
      fVar202 = (float)((uint)fVar123 & uVar51 | ~uVar51 & (uint)fVar279);
      fVar210 = (float)((uint)fVar126 & uVar53 | ~uVar53 & (uint)fVar290);
      fVar212 = (float)((uint)fVar128 & uVar55 | ~uVar55 & (uint)fVar293);
      local_498._0_4_ = (float)((uint)fVar268 & uVar54 | ~uVar54 & (uint)fVar143) - (float)local_3e8
      ;
      local_498._4_4_ =
           (float)((uint)fVar269 & uVar51 | ~uVar51 & (uint)fVar157) - (float)auStack_3e4._0_4_;
      fStack_490 = (float)((uint)fVar270 & uVar53 | ~uVar53 & (uint)fVar159) -
                   (float)auStack_3e4._4_4_;
      fStack_48c = (float)((uint)fVar271 & uVar55 | ~uVar55 & (uint)fVar160) - fStack_3dc;
      fVar250 = (float)((uint)fVar250 & uVar54 | ~uVar54 & (uint)fVar227) - fVar246;
      fVar143 = (float)((uint)fVar162 & uVar51 | ~uVar51 & (uint)fVar234) - fVar257;
      fVar157 = (float)((uint)fVar173 & uVar53 | ~uVar53 & (uint)fVar239) - fVar259;
      fVar159 = (float)((uint)fVar175 & uVar55 | ~uVar55 & (uint)fVar240) - fVar261;
      fVar277 = (float)((uint)fVar277 & uVar54 | ~uVar54 & (uint)fVar100) - fVar272;
      fVar279 = (float)((uint)fVar279 & uVar51 | ~uVar51 & (uint)fVar123) - fVar278;
      fVar290 = (float)((uint)fVar290 & uVar53 | ~uVar53 & (uint)fVar126) - fVar280;
      fVar293 = (float)((uint)fVar293 & uVar55 | ~uVar55 & (uint)fVar128) - fVar281;
      fVar213 = (float)local_3e8 - fVar209;
      fVar216 = (float)auStack_3e4._0_4_ - fVar223;
      fVar217 = (float)auStack_3e4._4_4_ - fVar199;
      fVar224 = fStack_3dc - fVar200;
      fVar268 = fVar246 - fVar241;
      fVar269 = fVar257 - fVar243;
      fVar270 = fVar259 - fVar244;
      fVar271 = fVar261 - fVar245;
      fVar227 = fVar272 - fVar176;
      fVar234 = fVar278 - fVar202;
      fVar239 = fVar280 - fVar210;
      fVar240 = fVar281 - fVar212;
      fVar160 = (fVar246 * fVar277 - fVar272 * fVar250) * 0.0 +
                (fVar272 * (float)local_498._0_4_ - (float)local_3e8 * fVar277) * 0.0 +
                ((float)local_3e8 * fVar250 - fVar246 * (float)local_498._0_4_);
      fVar162 = (fVar257 * fVar279 - fVar278 * fVar143) * 0.0 +
                (fVar278 * (float)local_498._4_4_ - (float)auStack_3e4._0_4_ * fVar279) * 0.0 +
                ((float)auStack_3e4._0_4_ * fVar143 - fVar257 * (float)local_498._4_4_);
      auVar147._4_4_ = fVar162;
      auVar147._0_4_ = fVar160;
      fVar173 = (fVar259 * fVar290 - fVar280 * fVar157) * 0.0 +
                (fVar280 * fStack_490 - (float)auStack_3e4._4_4_ * fVar290) * 0.0 +
                ((float)auStack_3e4._4_4_ * fVar157 - fVar259 * fStack_490);
      fVar175 = (fVar261 * fVar293 - fVar281 * fVar159) * 0.0 +
                (fVar281 * fStack_48c - fStack_3dc * fVar293) * 0.0 +
                (fStack_3dc * fVar159 - fVar261 * fStack_48c);
      auVar282._0_4_ =
           (fVar241 * fVar227 - fVar176 * fVar268) * 0.0 +
           (fVar176 * fVar213 - fVar209 * fVar227) * 0.0 + (fVar209 * fVar268 - fVar241 * fVar213);
      auVar282._4_4_ =
           (fVar243 * fVar234 - fVar202 * fVar269) * 0.0 +
           (fVar202 * fVar216 - fVar223 * fVar234) * 0.0 + (fVar223 * fVar269 - fVar243 * fVar216);
      auVar282._8_4_ =
           (fVar244 * fVar239 - fVar210 * fVar270) * 0.0 +
           (fVar210 * fVar217 - fVar199 * fVar239) * 0.0 + (fVar199 * fVar270 - fVar244 * fVar217);
      auVar282._12_4_ =
           (fVar245 * fVar240 - fVar212 * fVar271) * 0.0 +
           (fVar212 * fVar224 - fVar200 * fVar240) * 0.0 + (fVar200 * fVar271 - fVar245 * fVar224);
      auVar147._8_4_ = fVar173;
      auVar147._12_4_ = fVar175;
      auVar69 = maxps(auVar147,auVar282);
      bVar31 = auVar69._0_4_ <= 0.0 && bVar31;
      auVar148._0_4_ = -(uint)bVar31;
      bVar32 = auVar69._4_4_ <= 0.0 && bVar32;
      auVar148._4_4_ = -(uint)bVar32;
      bVar30 = auVar69._8_4_ <= 0.0 && bVar30;
      auVar148._8_4_ = -(uint)bVar30;
      bVar29 = auVar69._12_4_ <= 0.0 && bVar29;
      auVar148._12_4_ = -(uint)bVar29;
      iVar36 = movmskps(uVar52,auVar148);
      if (iVar36 == 0) {
LAB_003015b6:
        auVar149._8_8_ = uVar35;
        auVar149._0_8_ = uVar34;
      }
      else {
        fVar209 = (ray->super_RayK<1>).tfar;
        fVar243 = fVar268 * fVar277 - fVar227 * fVar250;
        fVar244 = fVar269 * fVar279 - fVar234 * fVar143;
        fVar245 = fVar270 * fVar290 - fVar239 * fVar157;
        fVar176 = fVar271 * fVar293 - fVar240 * fVar159;
        fVar223 = fVar227 * (float)local_498._0_4_ - fVar277 * fVar213;
        fVar200 = fVar234 * (float)local_498._4_4_ - fVar279 * fVar216;
        fVar234 = fVar239 * fStack_490 - fVar290 * fVar217;
        fVar240 = fVar240 * fStack_48c - fVar293 * fVar224;
        fVar268 = fVar213 * fVar250 - fVar268 * (float)local_498._0_4_;
        fVar269 = fVar216 * fVar143 - fVar269 * (float)local_498._4_4_;
        fVar270 = fVar217 * fVar157 - fVar270 * fStack_490;
        fVar271 = fVar224 * fVar159 - fVar271 * fStack_48c;
        auVar195._0_4_ = fVar243 * 0.0 + fVar223 * 0.0 + fVar268;
        auVar195._4_4_ = fVar244 * 0.0 + fVar200 * 0.0 + fVar269;
        auVar195._8_4_ = fVar245 * 0.0 + fVar234 * 0.0 + fVar270;
        auVar195._12_4_ = fVar176 * 0.0 + fVar240 * 0.0 + fVar271;
        auVar69 = rcpps(_local_498,auVar195);
        fVar199 = auVar69._0_4_;
        fVar227 = auVar69._4_4_;
        fVar239 = auVar69._8_4_;
        fVar241 = auVar69._12_4_;
        fVar199 = (1.0 - auVar195._0_4_ * fVar199) * fVar199 + fVar199;
        fVar227 = (1.0 - auVar195._4_4_ * fVar227) * fVar227 + fVar227;
        fVar239 = (1.0 - auVar195._8_4_ * fVar239) * fVar239 + fVar239;
        fVar241 = (1.0 - auVar195._12_4_ * fVar241) * fVar241 + fVar241;
        fVar223 = (fVar272 * fVar268 + fVar246 * fVar223 + (float)local_3e8 * fVar243) * fVar199;
        fVar200 = (fVar278 * fVar269 + fVar257 * fVar200 + (float)auStack_3e4._0_4_ * fVar244) *
                  fVar227;
        aVar253.v[1] = fVar200;
        aVar253.v[0] = fVar223;
        fVar234 = (fVar280 * fVar270 + fVar259 * fVar234 + (float)auStack_3e4._4_4_ * fVar245) *
                  fVar239;
        fVar240 = (fVar281 * fVar271 + fVar261 * fVar240 + fStack_3dc * fVar176) * fVar241;
        bVar31 = (fVar223 <= fVar209 && local_1e8 <= fVar223) && bVar31;
        auVar86._0_4_ = -(uint)bVar31;
        bVar32 = (fVar200 <= fVar209 && local_1e8 <= fVar200) && bVar32;
        auVar86._4_4_ = -(uint)bVar32;
        bVar30 = (fVar234 <= fVar209 && local_1e8 <= fVar234) && bVar30;
        auVar86._8_4_ = -(uint)bVar30;
        bVar29 = (fVar240 <= fVar209 && local_1e8 <= fVar240) && bVar29;
        auVar86._12_4_ = -(uint)bVar29;
        iVar36 = movmskps(iVar36,auVar86);
        if (iVar36 == 0) goto LAB_003015b6;
        auVar87._0_8_ =
             CONCAT44(-(uint)(auVar195._4_4_ != 0.0 && bVar32),
                      -(uint)(auVar195._0_4_ != 0.0 && bVar31));
        auVar87._8_4_ = -(uint)(auVar195._8_4_ != 0.0 && bVar30);
        auVar87._12_4_ = -(uint)(auVar195._12_4_ != 0.0 && bVar29);
        iVar36 = movmskps(iVar36,auVar87);
        auVar149._8_8_ = uVar35;
        auVar149._0_8_ = uVar34;
        if (iVar36 != 0) {
          fVar160 = fVar160 * fVar199;
          fVar162 = fVar162 * fVar227;
          fVar173 = fVar173 * fVar239;
          fVar175 = fVar175 * fVar241;
          auVar108._0_4_ = ~uVar54 & (uint)fVar160;
          auVar108._4_4_ = ~uVar51 & (uint)fVar162;
          auVar108._8_4_ = ~uVar53 & (uint)fVar173;
          auVar108._12_4_ = ~uVar55 & (uint)fVar175;
          auVar264._0_4_ = (uint)(1.0 - fVar160) & uVar54;
          auVar264._4_4_ = (uint)(1.0 - fVar162) & uVar51;
          auVar264._8_4_ = (uint)(1.0 - fVar173) & uVar53;
          auVar264._12_4_ = (uint)(1.0 - fVar175) & uVar55;
          aVar265 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar264 | auVar108);
          auVar149._8_4_ = auVar87._8_4_;
          auVar149._0_8_ = auVar87._0_8_;
          auVar149._12_4_ = auVar87._12_4_;
          aVar253.v[2] = fVar234;
          aVar253.v[3] = fVar240;
          local_1a8 = (float)(~uVar54 & (uint)(auVar282._0_4_ * fVar199) |
                             (uint)(1.0 - auVar282._0_4_ * fVar199) & uVar54);
          fStack_1a4 = (float)(~uVar51 & (uint)(auVar282._4_4_ * fVar227) |
                              (uint)(1.0 - auVar282._4_4_ * fVar227) & uVar51);
          fStack_1a0 = (float)(~uVar53 & (uint)(auVar282._8_4_ * fVar239) |
                              (uint)(1.0 - auVar282._8_4_ * fVar239) & uVar53);
          fStack_19c = (float)(~uVar55 & (uint)(auVar282._12_4_ * fVar241) |
                              (uint)(1.0 - auVar282._12_4_ * fVar241) & uVar55);
          aVar252 = aVar253;
        }
      }
      uVar52 = movmskps(iVar36,auVar149);
      puVar39 = (undefined1 *)(ulong)uVar52;
      if (uVar52 != 0) {
        fVar223 = (auVar262._0_4_ - (float)local_208._0_4_) * aVar265.v[0] + (float)local_208._0_4_;
        fVar199 = (auVar262._4_4_ - (float)local_208._4_4_) * aVar265.v[1] + (float)local_208._4_4_;
        fVar200 = (auVar262._8_4_ - fStack_200) * aVar265.v[2] + fStack_200;
        fVar227 = (auVar262._12_4_ - fStack_1fc) * aVar265.v[3] + fStack_1fc;
        fVar209 = pre->depth_scale;
        aVar88._0_4_ = -(uint)(fVar209 * (fVar223 + fVar223) < aVar252.v[0]) & auVar149._0_4_;
        aVar88._4_4_ = -(uint)(fVar209 * (fVar199 + fVar199) < aVar252.v[1]) & auVar149._4_4_;
        aVar88.i[2] = -(uint)(fVar209 * (fVar200 + fVar200) < aVar252.v[2]) & auVar149._8_4_;
        aVar88.i[3] = -(uint)(fVar209 * (fVar227 + fVar227) < aVar252.v[3]) & auVar149._12_4_;
        uVar52 = movmskps(uVar52,(undefined1  [16])aVar88);
        puVar39 = (undefined1 *)(ulong)uVar52;
        if (uVar52 != 0) {
          local_1a8 = local_1a8 + local_1a8 + -1.0;
          fStack_1a4 = fStack_1a4 + fStack_1a4 + -1.0;
          fStack_1a0 = fStack_1a0 + fStack_1a0 + -1.0;
          fStack_19c = fStack_19c + fStack_19c + -1.0;
          bhit.U.field_0 = aVar265;
          bhit.V.field_0.v[0] = local_1a8;
          bhit.V.field_0.v[1] = fStack_1a4;
          bhit.V.field_0.v[2] = fStack_1a0;
          bhit.V.field_0.v[3] = fStack_19c;
          bhit.T.field_0 = aVar252;
          bhit.i = 0;
          bhit.N = iVar6;
          bhit.curve3D.v0.field_0._0_8_ = *(undefined8 *)pfVar1;
          bhit.curve3D.v0.field_0._8_8_ = *(undefined8 *)(pfVar1 + 2);
          bhit.curve3D.v1.field_0.m128[0] = fVar122;
          bhit.curve3D.v1.field_0.m128[1] = fVar125;
          bhit.curve3D.v1.field_0.m128[2] = fVar130;
          bhit.curve3D.v1.field_0.m128[3] = fVar140;
          bhit.curve3D.v2.field_0.m128[0] = fVar142;
          bhit.curve3D.v2.field_0.m128[1] = fVar156;
          bhit.curve3D.v2.field_0.m128[2] = fVar158;
          bhit.curve3D.v2.field_0.m128[3] = fVar161;
          bhit.curve3D.v3.field_0._0_8_ = *(undefined8 *)pfVar2;
          bhit.curve3D.v3.field_0._8_8_ = *(undefined8 *)pfVar12;
          bhit.valid.field_0 = aVar88;
          uVar52 = (ray->super_RayK<1>).mask;
          puVar39 = (undefined1 *)(ulong)uVar52;
          if ((pGVar7->mask & uVar52) != 0) {
            valid.field_0 = aVar88;
            fVar209 = 1.0 / local_228;
            bhit.vu.field_0.v[0] = fVar209 * (aVar265.v[0] + 0.0);
            bhit.vu.field_0.v[1] = fVar209 * (aVar265.v[1] + 1.0);
            bhit.vu.field_0.v[2] = fVar209 * (aVar265.v[2] + 2.0);
            bhit.vu.field_0.v[3] = fVar209 * (aVar265.v[3] + 3.0);
            bhit.vv.field_0._0_8_ = CONCAT44(fStack_1a4,local_1a8);
            bhit.vv.field_0._8_8_ = CONCAT44(fStack_19c,fStack_1a0);
            bhit.vt.field_0 = aVar252;
            auVar109._0_4_ = aVar88._0_4_ & (uint)aVar252.v[0];
            auVar109._4_4_ = aVar88._4_4_ & (uint)aVar252.v[1];
            auVar109._8_4_ = aVar88.i[2] & (uint)aVar252.v[2];
            auVar109._12_4_ = aVar88.i[3] & (uint)aVar252.v[3];
            auVar133._0_8_ = CONCAT44(~aVar88._4_4_,~aVar88._0_4_) & 0x7f8000007f800000;
            auVar133._8_4_ = ~aVar88.i[2] & 0x7f800000;
            auVar133._12_4_ = ~aVar88.i[3] & 0x7f800000;
            auVar133 = auVar133 | auVar109;
            auVar150._4_4_ = auVar133._0_4_;
            auVar150._0_4_ = auVar133._4_4_;
            auVar150._8_4_ = auVar133._12_4_;
            auVar150._12_4_ = auVar133._8_4_;
            auVar69 = minps(auVar150,auVar133);
            auVar110._0_8_ = auVar69._8_8_;
            auVar110._8_4_ = auVar69._0_4_;
            auVar110._12_4_ = auVar69._4_4_;
            auVar69 = minps(auVar110,auVar69);
            auVar111._0_8_ =
                 CONCAT44(-(uint)(auVar69._4_4_ == auVar133._4_4_) & aVar88._4_4_,
                          -(uint)(auVar69._0_4_ == auVar133._0_4_) & aVar88._0_4_);
            auVar111._8_4_ = -(uint)(auVar69._8_4_ == auVar133._8_4_) & aVar88.i[2];
            auVar111._12_4_ = -(uint)(auVar69._12_4_ == auVar133._12_4_) & aVar88.i[3];
            iVar36 = movmskps(uVar52,auVar111);
            if (iVar36 != 0) {
              aVar88.i[2] = auVar111._8_4_;
              aVar88._0_8_ = auVar111._0_8_;
              aVar88.i[3] = auVar111._12_4_;
            }
            uVar52 = movmskps(iVar36,(undefined1  [16])aVar88);
            lVar44 = 0;
            if (uVar52 != 0) {
              for (; (uVar52 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
              }
            }
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar209 = bhit.vu.field_0.v[lVar44];
              fVar199 = 1.0 - fVar209;
              fVar223 = fVar209 * 3.0;
              fVar234 = ((fVar223 + 2.0) * (fVar199 + fVar199) + fVar199 * -3.0 * fVar199) * 0.5;
              fVar200 = (fVar199 * -2.0 * fVar209 + fVar209 * fVar209) * 0.5;
              fVar227 = (fVar209 * fVar223 + (fVar223 + -5.0) * (fVar209 + fVar209)) * 0.5;
              fVar223 = bhit.vv.field_0.v[lVar44];
              fVar199 = (fVar209 * (fVar199 + fVar199) - fVar199 * fVar199) * 0.5;
              (ray->super_RayK<1>).tfar = bhit.vt.field_0.v[lVar44];
              *(ulong *)&(ray->Ng).field_0 =
                   CONCAT44(fVar199 * fStack_384 +
                            fVar227 * fVar125 + fVar234 * fVar156 + fVar200 * fVar174,
                            fVar199 * local_388 +
                            fVar227 * fVar122 + fVar234 * fVar142 + fVar200 * fVar172);
              (ray->Ng).field_0.field_0.z =
                   fVar199 * fStack_380 + fVar227 * fVar130 + fVar234 * fVar158 + fVar200 * fVar215;
              ray->u = fVar209;
              ray->v = fVar223;
              ray->primID = uVar50;
              ray->geomID = uVar49;
              ray->instID[0] = context->user->instID[0];
              uVar49 = context->user->instPrimID[0];
              puVar39 = (undefined1 *)(ulong)uVar49;
              ray->instPrimID[0] = uVar49;
            }
            else {
              _local_498 = ZEXT416((uint)(ray->super_RayK<1>).tfar);
              local_458.v = aVar265.v;
              local_468.v = aVar252.v;
LAB_00302620:
              local_25c = bhit.vu.field_0.v[lVar44];
              local_258 = bhit.vv.field_0.v[lVar44];
              (ray->super_RayK<1>).tfar = bhit.vt.field_0.v[lVar44];
              fVar209 = 1.0 - local_25c;
              fVar199 = local_25c * 3.0;
              fVar200 = ((fVar199 + 2.0) * (fVar209 + fVar209) + fVar209 * -3.0 * fVar209) * 0.5;
              fVar223 = (fVar209 * -2.0 * local_25c + local_25c * local_25c) * 0.5;
              fVar199 = (local_25c * fVar199 + (fVar199 + -5.0) * (local_25c + local_25c)) * 0.5;
              fVar209 = (local_25c * (fVar209 + fVar209) - fVar209 * fVar209) * 0.5;
              args.context = context->user;
              local_268 = CONCAT44(fVar209 * fStack_384 +
                                   fVar199 * fVar125 + fVar200 * fVar156 + fVar223 * fVar174,
                                   fVar209 * local_388 +
                                   fVar199 * fVar122 + fVar200 * fVar142 + fVar223 * fVar172);
              local_260 = fVar209 * fStack_380 +
                          fVar199 * fVar130 + fVar200 * fVar158 + fVar223 * fVar215;
              local_254 = (int)local_3b0;
              local_250 = (int)local_420;
              local_24c = (args.context)->instID[0];
              local_248 = (args.context)->instPrimID[0];
              local_47c = -1;
              args.valid = &local_47c;
              args.geometryUserPtr = pGVar7->userPtr;
              args.ray = (RTCRayN *)ray;
              args.hit = (RTCHitN *)&local_268;
              args.N = 1;
              if ((pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                 ((*pGVar7->intersectionFilterN)(&args), pGVar42 = extraout_RDX_01,
                 context = local_3b8, ray = local_230, aVar252 = local_468, aVar265 = local_458,
                 fVar142 = local_408, fVar156 = fStack_404, fVar158 = fStack_400,
                 fVar211 = local_3d8, fVar284 = fStack_3d4, fVar286 = fStack_3d0,
                 fVar288 = fStack_3cc, fVar122 = local_3f8, fVar125 = fStack_3f4,
                 fVar130 = fStack_3f0, *args.valid != 0)) {
                p_Var9 = context->args->filter;
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                      RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                    && ((*p_Var9)(&args), pGVar42 = extraout_RDX_02, context = local_3b8,
                       ray = local_230, aVar252 = local_468, aVar265 = local_458,
                       fVar142 = local_408, fVar156 = fStack_404, fVar158 = fStack_400,
                       fVar211 = local_3d8, fVar284 = fStack_3d4, fVar286 = fStack_3d0,
                       fVar288 = fStack_3cc, fVar122 = local_3f8, fVar125 = fStack_3f4,
                       fVar130 = fStack_3f0, *args.valid == 0)))) goto LAB_003028eb;
                *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                pGVar42 = (Geometry *)(ulong)*(uint *)(args.hit + 0x1c);
                *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
                pRVar40 = args.ray;
              }
              else {
LAB_003028eb:
                (local_230->super_RayK<1>).tfar = (float)local_498._0_4_;
                pRVar40 = (RTCRayN *)args.valid;
                context = local_3b8;
                ray = local_230;
                aVar252 = local_468;
                aVar265 = local_458;
                fVar142 = local_408;
                fVar156 = fStack_404;
                fVar158 = fStack_400;
                fVar211 = local_3d8;
                fVar284 = fStack_3d4;
                fVar286 = fStack_3d0;
                fVar288 = fStack_3cc;
                fVar122 = local_3f8;
                fVar125 = fStack_3f4;
                fVar130 = fStack_3f0;
              }
              valid.field_0.v[lVar44] = 0.0;
              fVar209 = (ray->super_RayK<1>).tfar;
              local_498._0_4_ = (ray->super_RayK<1>).tfar;
              local_498._4_4_ = (ray->super_RayK<1>).mask;
              fStack_490 = (float)(ray->super_RayK<1>).id;
              fStack_48c = (float)(ray->super_RayK<1>).flags;
              aVar92._0_4_ = -(uint)(aVar252.v[0] <= fVar209) & valid.field_0.i[0];
              aVar92._4_4_ = -(uint)(aVar252.v[1] <= fVar209) & valid.field_0.i[1];
              aVar92.i[2] = -(uint)(aVar252.v[2] <= fVar209) & valid.field_0.i[2];
              aVar92.i[3] = -(uint)(aVar252.v[3] <= fVar209) & valid.field_0.i[3];
              valid.field_0 = aVar92;
              uVar41 = (undefined4)((ulong)pRVar40 >> 0x20);
              iVar36 = movmskps((int)pRVar40,(undefined1  [16])aVar92);
              puVar39 = (undefined1 *)CONCAT44(uVar41,iVar36);
              if (iVar36 != 0) {
                auVar119._0_4_ = aVar92._0_4_ & (uint)aVar252.v[0];
                auVar119._4_4_ = aVar92._4_4_ & (uint)aVar252.v[1];
                auVar119._8_4_ = aVar92.i[2] & (uint)aVar252.v[2];
                auVar119._12_4_ = aVar92.i[3] & (uint)aVar252.v[3];
                auVar139._0_8_ = CONCAT44(~aVar92._4_4_,~aVar92._0_4_) & 0x7f8000007f800000;
                auVar139._8_4_ = ~aVar92.i[2] & 0x7f800000;
                auVar139._12_4_ = ~aVar92.i[3] & 0x7f800000;
                auVar139 = auVar139 | auVar119;
                auVar155._4_4_ = auVar139._0_4_;
                auVar155._0_4_ = auVar139._4_4_;
                auVar155._8_4_ = auVar139._12_4_;
                auVar155._12_4_ = auVar139._8_4_;
                auVar69 = minps(auVar155,auVar139);
                auVar120._0_8_ = auVar69._8_8_;
                auVar120._8_4_ = auVar69._0_4_;
                auVar120._12_4_ = auVar69._4_4_;
                auVar69 = minps(auVar120,auVar69);
                auVar121._0_8_ =
                     CONCAT44(-(uint)(auVar69._4_4_ == auVar139._4_4_) & aVar92._4_4_,
                              -(uint)(auVar69._0_4_ == auVar139._0_4_) & aVar92._0_4_);
                auVar121._8_4_ = -(uint)(auVar69._8_4_ == auVar139._8_4_) & aVar92.i[2];
                auVar121._12_4_ = -(uint)(auVar69._12_4_ == auVar139._12_4_) & aVar92.i[3];
                iVar36 = movmskps(iVar36,auVar121);
                if (iVar36 != 0) {
                  aVar92.i[2] = auVar121._8_4_;
                  aVar92._0_8_ = auVar121._0_8_;
                  aVar92.i[3] = auVar121._12_4_;
                }
                uVar37 = movmskps(iVar36,(undefined1  [16])aVar92);
                uVar38 = CONCAT44(uVar41,uVar37);
                lVar44 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
                  }
                }
                goto LAB_00302620;
              }
            }
          }
        }
      }
    }
    uVar41 = SUB84(puVar39,0);
    local_468 = aVar252;
    local_458 = aVar265;
    if (4 < iVar6) {
      fVar122 = 1.0 / local_228;
      lVar44 = 4;
      local_3d8 = fVar211;
      fStack_3d4 = fVar284;
      fStack_3d0 = fVar286;
      fStack_3cc = fVar288;
      bhit.N = iVar6;
      while( true ) {
        uVar41 = SUB84(puVar39,0);
        if (lVar43 <= lVar44) break;
        bhit.i = (int)lVar44;
        pfVar1 = (float *)(catmullrom_basis0 + lVar44 * 4 + lVar46);
        fVar125 = *pfVar1;
        fVar130 = pfVar1[1];
        fVar142 = pfVar1[2];
        fVar156 = pfVar1[3];
        pfVar1 = (float *)(lVar46 + 0x22047f0 + lVar44 * 4);
        local_398 = *pfVar1;
        fStack_394 = pfVar1[1];
        fStack_390 = pfVar1[2];
        fStack_38c = pfVar1[3];
        pfVar1 = (float *)(lVar46 + 0x2204c74 + lVar44 * 4);
        local_3a8 = *pfVar1;
        fStack_3a4 = pfVar1[1];
        fStack_3a0 = pfVar1[2];
        fStack_39c = pfVar1[3];
        pfVar1 = (float *)(lVar46 + 0x22050f8 + lVar44 * 4);
        fVar158 = *pfVar1;
        fVar209 = pfVar1[1];
        fVar211 = pfVar1[2];
        fVar223 = pfVar1[3];
        fVar293 = local_188 * fVar125 +
                  local_448 * local_398 + fVar248 * local_3a8 + fVar177 * fVar158;
        fVar272 = fStack_184 * fVar130 +
                  fStack_444 * fStack_394 + fVar248 * fStack_3a4 + fVar177 * fVar209;
        fVar278 = fStack_180 * fVar142 +
                  fStack_440 * fStack_390 + fVar248 * fStack_3a0 + fVar177 * fVar211;
        fVar280 = fStack_17c * fVar156 +
                  fStack_43c * fStack_38c + fVar248 * fStack_39c + fVar177 * fVar223;
        local_198 = local_1f8 * fVar125 +
                    local_218 * local_398 + fVar255 * local_3a8 + local_478 * fVar158;
        fStack_194 = fStack_1f4 * fVar130 +
                     fStack_214 * fStack_394 + fVar255 * fStack_3a4 + fStack_474 * fVar209;
        fStack_190 = fStack_1f0 * fVar142 +
                     fStack_210 * fStack_390 + fVar255 * fStack_3a0 + fStack_470 * fVar211;
        fStack_18c = fStack_1ec * fVar156 +
                     fStack_20c * fStack_38c + fVar255 * fStack_39c + fStack_46c * fVar223;
        local_3e8 = (undefined1  [4])
                    (fVar141 * fVar125 +
                    fVar140 * local_398 + fVar161 * local_3a8 + fVar201 * fVar158);
        auStack_3e4._0_4_ =
             fVar141 * fVar130 + fVar140 * fStack_394 + fVar161 * fStack_3a4 + fVar201 * fVar209;
        auStack_3e4._4_4_ =
             fVar141 * fVar142 + fVar140 * fStack_390 + fVar161 * fStack_3a0 + fVar201 * fVar211;
        fStack_3dc = fVar141 * fVar156 +
                     fVar140 * fStack_38c + fVar161 * fStack_39c + fVar201 * fVar223;
        puVar39 = catmullrom_basis1 + lVar46;
        pfVar1 = (float *)(puVar39 + lVar44 * 4);
        fVar199 = *pfVar1;
        fVar200 = pfVar1[1];
        fVar227 = pfVar1[2];
        fVar234 = pfVar1[3];
        pfVar1 = (float *)(lVar46 + 0x2206c10 + lVar44 * 4);
        fVar239 = *pfVar1;
        fVar240 = pfVar1[1];
        fVar241 = pfVar1[2];
        fVar243 = pfVar1[3];
        pfVar1 = (float *)(lVar46 + 0x2207094 + lVar44 * 4);
        fVar244 = *pfVar1;
        fVar245 = pfVar1[1];
        fVar246 = pfVar1[2];
        fVar257 = pfVar1[3];
        pauVar4 = (undefined1 (*) [12])(lVar46 + 0x2207518 + lVar44 * 4);
        fVar259 = *(float *)*pauVar4;
        fVar261 = *(float *)(*pauVar4 + 4);
        fVar268 = *(float *)(*pauVar4 + 8);
        auVar14 = *pauVar4;
        fVar269 = *(float *)pauVar4[1];
        local_208._0_4_ =
             local_188 * fVar199 + local_448 * fVar239 + fVar248 * fVar244 + fVar177 * fVar259;
        local_208._4_4_ =
             fStack_184 * fVar200 + fStack_444 * fVar240 + fVar248 * fVar245 + fVar177 * fVar261;
        fStack_200 = fStack_180 * fVar227 +
                     fStack_440 * fVar241 + fVar248 * fVar246 + fVar177 * fVar268;
        fStack_1fc = fStack_17c * fVar234 +
                     fStack_43c * fVar243 + fVar248 * fVar257 + fVar177 * fVar269;
        fVar271 = local_1f8 * fVar199 +
                  local_218 * fVar239 + fVar255 * fVar244 + local_478 * fVar259;
        fVar277 = fStack_1f4 * fVar200 +
                  fStack_214 * fVar240 + fVar255 * fVar245 + fStack_474 * fVar261;
        fVar279 = fStack_1f0 * fVar227 +
                  fStack_210 * fVar241 + fVar255 * fVar246 + fStack_470 * fVar268;
        fVar290 = fStack_1ec * fVar234 +
                  fStack_20c * fVar243 + fVar255 * fVar257 + fStack_46c * fVar269;
        auVar266._0_4_ =
             fVar141 * fVar199 + fVar140 * fVar239 + fVar161 * fVar244 + fVar201 * fVar259;
        auVar266._4_4_ =
             fVar141 * fVar200 + fVar140 * fVar240 + fVar161 * fVar245 + fVar201 * fVar261;
        auVar266._8_4_ =
             fVar141 * fVar227 + fVar140 * fVar241 + fVar161 * fVar246 + fVar201 * fVar268;
        auVar266._12_4_ =
             fVar141 * fVar234 + fVar140 * fVar243 + fVar161 * fVar257 + fVar201 * fVar269;
        fVar259 = (float)local_208._0_4_ - fVar293;
        fVar261 = (float)local_208._4_4_ - fVar272;
        fVar268 = fStack_200 - fVar278;
        fVar270 = fStack_1fc - fVar280;
        local_228 = fVar271 - local_198;
        fStack_224 = fVar277 - fStack_194;
        fStack_220 = fVar279 - fStack_190;
        fStack_21c = fVar290 - fStack_18c;
        fVar281 = local_198 * fVar259 - fVar293 * local_228;
        fVar250 = fStack_194 * fVar261 - fVar272 * fStack_224;
        fVar284 = fStack_190 * fVar268 - fVar278 * fStack_220;
        fVar286 = fStack_18c * fVar270 - fVar280 * fStack_21c;
        auVar69 = maxps(_local_3e8,auVar266);
        bVar30 = fVar281 * fVar281 <=
                 auVar69._0_4_ * auVar69._0_4_ * (fVar259 * fVar259 + local_228 * local_228) &&
                 bhit.i < iVar6;
        local_1b8._0_4_ = -(uint)bVar30;
        bVar29 = (int)(bhit.i | 1U) < iVar6 &&
                 fVar250 * fVar250 <=
                 auVar69._4_4_ * auVar69._4_4_ * (fVar261 * fVar261 + fStack_224 * fStack_224);
        local_1b8._4_4_ = -(uint)bVar29;
        bVar31 = fVar284 * fVar284 <=
                 auVar69._8_4_ * auVar69._8_4_ * (fVar268 * fVar268 + fStack_220 * fStack_220) &&
                 (int)(bhit.i | 2U) < iVar6;
        fStack_1b0 = (float)-(uint)bVar31;
        bVar32 = fVar286 * fVar286 <=
                 auVar69._12_4_ * auVar69._12_4_ * (fVar270 * fVar270 + fStack_21c * fStack_21c) &&
                 (int)(bhit.i | 3U) < iVar6;
        fStack_1ac = (float)-(uint)bVar32;
        uVar49 = movmskps((int)pGVar42,_local_1b8);
        pGVar42 = (Geometry *)(ulong)uVar49;
        if (uVar49 != 0) {
          local_498._0_4_ = auVar14._0_4_;
          local_498._4_4_ = auVar14._4_4_;
          fStack_490 = auVar14._8_4_;
          fVar175 = (float)local_498._0_4_ * local_3d8 + fVar244 * local_1d8 + fVar239 * fVar247 +
                    fVar199 * local_3c8;
          fVar202 = (float)local_498._4_4_ * fStack_3d4 + fVar245 * fStack_1d4 + fVar240 * fVar247 +
                    fVar200 * fStack_3c4;
          fVar212 = fStack_490 * fStack_3d0 + fVar246 * fStack_1d0 + fVar241 * fVar247 +
                    fVar227 * fStack_3c0;
          fVar216 = fVar269 * fStack_3cc + fVar257 * fStack_1cc + fVar243 * fVar247 +
                    fVar234 * fStack_3bc;
          fVar176 = fVar158 * local_3d8 + local_3a8 * local_1d8 + local_398 * fVar247 +
                    fVar125 * local_3c8;
          fVar210 = fVar209 * fStack_3d4 + fStack_3a4 * fStack_1d4 + fStack_394 * fVar247 +
                    fVar130 * fStack_3c4;
          fVar213 = fVar211 * fStack_3d0 + fStack_3a0 * fStack_1d0 + fStack_390 * fVar247 +
                    fVar142 * fStack_3c0;
          fVar217 = fVar223 * fStack_3cc + fStack_39c * fStack_1cc + fStack_38c * fVar247 +
                    fVar156 * fStack_3bc;
          pfVar1 = (float *)(lVar46 + 0x220557c + lVar44 * 4);
          fVar125 = *pfVar1;
          fVar130 = pfVar1[1];
          fVar142 = pfVar1[2];
          fVar156 = pfVar1[3];
          pfVar1 = (float *)(lVar46 + 0x2205a00 + lVar44 * 4);
          fVar158 = *pfVar1;
          fVar209 = pfVar1[1];
          fVar211 = pfVar1[2];
          fVar223 = pfVar1[3];
          pfVar1 = (float *)(lVar46 + 0x2205e84 + lVar44 * 4);
          fVar199 = *pfVar1;
          fVar200 = pfVar1[1];
          fVar227 = pfVar1[2];
          fVar234 = pfVar1[3];
          pfVar1 = (float *)(lVar46 + 0x2206308 + lVar44 * 4);
          fVar239 = *pfVar1;
          fVar240 = pfVar1[1];
          fVar241 = pfVar1[2];
          fVar243 = pfVar1[3];
          fVar251 = local_188 * fVar125 +
                    local_448 * fVar158 + fVar248 * fVar199 + fVar177 * fVar239;
          fVar58 = fStack_184 * fVar130 +
                   fStack_444 * fVar209 + fVar248 * fVar200 + fVar177 * fVar240;
          fVar96 = fStack_180 * fVar142 +
                   fStack_440 * fVar211 + fVar248 * fVar227 + fVar177 * fVar241;
          fVar101 = fStack_17c * fVar156 +
                    fStack_43c * fVar223 + fVar248 * fVar234 + fVar177 * fVar243;
          fVar224 = local_1f8 * fVar125 +
                    local_218 * fVar158 + fVar255 * fVar199 + local_478 * fVar239;
          fVar225 = fStack_1f4 * fVar130 +
                    fStack_214 * fVar209 + fVar255 * fVar200 + fStack_474 * fVar240;
          fVar228 = fStack_1f0 * fVar142 +
                    fStack_210 * fVar211 + fVar255 * fVar227 + fStack_470 * fVar241;
          fVar229 = fStack_1ec * fVar156 +
                    fStack_20c * fVar223 + fVar255 * fVar234 + fStack_46c * fVar243;
          pfVar1 = (float *)(lVar46 + 0x220799c + lVar44 * 4);
          fVar244 = *pfVar1;
          fVar245 = pfVar1[1];
          fVar246 = pfVar1[2];
          fVar257 = pfVar1[3];
          pfVar1 = (float *)(lVar46 + 0x22082a4 + lVar44 * 4);
          fVar269 = *pfVar1;
          fVar281 = pfVar1[1];
          fVar250 = pfVar1[2];
          fVar284 = pfVar1[3];
          pfVar1 = (float *)(lVar46 + 0x2208728 + lVar44 * 4);
          fVar286 = *pfVar1;
          fVar288 = pfVar1[1];
          fVar143 = pfVar1[2];
          fVar157 = pfVar1[3];
          pfVar1 = (float *)(lVar46 + 0x2207e20 + lVar44 * 4);
          fVar159 = *pfVar1;
          fVar160 = pfVar1[1];
          fVar162 = pfVar1[2];
          fVar173 = pfVar1[3];
          fVar100 = local_188 * fVar244 +
                    local_448 * fVar159 + fVar248 * fVar269 + fVar177 * fVar286;
          fVar124 = fStack_184 * fVar245 +
                    fStack_444 * fVar160 + fVar248 * fVar281 + fVar177 * fVar288;
          fVar123 = fStack_180 * fVar246 +
                    fStack_440 * fVar162 + fVar248 * fVar250 + fVar177 * fVar143;
          fVar127 = fStack_17c * fVar257 +
                    fStack_43c * fVar173 + fVar248 * fVar284 + fVar177 * fVar157;
          fVar231 = local_1f8 * fVar244 +
                    local_218 * fVar159 + fVar255 * fVar269 + local_478 * fVar286;
          fVar232 = fStack_1f4 * fVar245 +
                    fStack_214 * fVar160 + fVar255 * fVar281 + fStack_474 * fVar288;
          fVar291 = fStack_1f0 * fVar246 +
                    fStack_210 * fVar162 + fVar255 * fVar250 + fStack_470 * fVar143;
          fVar214 = fStack_1ec * fVar257 +
                    fStack_20c * fVar173 + fVar255 * fVar284 + fStack_46c * fVar157;
          auVar267._0_8_ = CONCAT44(fVar58,fVar251) & 0x7fffffff7fffffff;
          auVar267._8_4_ = ABS(fVar96);
          auVar267._12_4_ = ABS(fVar101);
          auVar196._0_8_ = CONCAT44(fVar225,fVar224) & 0x7fffffff7fffffff;
          auVar196._8_4_ = ABS(fVar228);
          auVar196._12_4_ = ABS(fVar229);
          auVar69 = maxps(auVar267,auVar196);
          auVar275._0_8_ =
               CONCAT44(fVar130 * fStack_3c4 +
                        fVar209 * fVar247 + fVar200 * fStack_1d4 + fVar240 * fStack_3d4,
                        fVar125 * local_3c8 +
                        fVar158 * fVar247 + fVar199 * local_1d8 + fVar239 * local_3d8) &
               0x7fffffff7fffffff;
          auVar275._8_4_ =
               ABS(fVar142 * fStack_3c0 +
                   fVar211 * fVar247 + fVar227 * fStack_1d0 + fVar241 * fStack_3d0);
          auVar275._12_4_ =
               ABS(fVar156 * fStack_3bc +
                   fVar223 * fVar247 + fVar234 * fStack_1cc + fVar243 * fStack_3cc);
          auVar69 = maxps(auVar69,auVar275);
          uVar49 = -(uint)(local_2e8 <= auVar69._0_4_);
          uVar50 = -(uint)(local_2e8 <= auVar69._4_4_);
          uVar52 = -(uint)(local_2e8 <= auVar69._8_4_);
          uVar54 = -(uint)(local_2e8 <= auVar69._12_4_);
          auVar197._0_4_ = ~uVar49 & (uint)fVar259;
          auVar197._4_4_ = ~uVar50 & (uint)fVar261;
          auVar197._8_4_ = ~uVar52 & (uint)fVar268;
          auVar197._12_4_ = ~uVar54 & (uint)fVar270;
          auVar254._0_4_ = (uint)fVar251 & uVar49;
          auVar254._4_4_ = (uint)fVar58 & uVar50;
          auVar254._8_4_ = (uint)fVar96 & uVar52;
          auVar254._12_4_ = (uint)fVar101 & uVar54;
          auVar254 = auVar254 | auVar197;
          fVar200 = (float)(~uVar49 & (uint)local_228 | (uint)fVar224 & uVar49);
          fVar234 = (float)(~uVar50 & (uint)fStack_224 | (uint)fVar225 & uVar50);
          fVar225 = (float)(~uVar52 & (uint)fStack_220 | (uint)fVar228 & uVar52);
          fVar229 = (float)(~uVar54 & (uint)fStack_21c | (uint)fVar229 & uVar54);
          auVar276._0_8_ = CONCAT44(fVar124,fVar100) & 0x7fffffff7fffffff;
          auVar276._8_4_ = ABS(fVar123);
          auVar276._12_4_ = ABS(fVar127);
          auVar134._0_8_ = CONCAT44(fVar232,fVar231) & 0x7fffffff7fffffff;
          auVar134._8_4_ = ABS(fVar291);
          auVar134._12_4_ = ABS(fVar214);
          auVar69 = maxps(auVar276,auVar134);
          auVar89._0_8_ =
               CONCAT44(fVar245 * fStack_3c4 +
                        fVar160 * fVar247 + fVar281 * fStack_1d4 + fVar288 * fStack_3d4,
                        fVar244 * local_3c8 +
                        fVar159 * fVar247 + fVar269 * local_1d8 + fVar286 * local_3d8) &
               0x7fffffff7fffffff;
          auVar89._8_4_ =
               ABS(fVar246 * fStack_3c0 +
                   fVar162 * fVar247 + fVar250 * fStack_1d0 + fVar143 * fStack_3d0);
          auVar89._12_4_ =
               ABS(fVar257 * fStack_3bc +
                   fVar173 * fVar247 + fVar284 * fStack_1cc + fVar157 * fStack_3cc);
          auVar69 = maxps(auVar69,auVar89);
          uVar49 = -(uint)(local_2e8 <= auVar69._0_4_);
          uVar50 = -(uint)(local_2e8 <= auVar69._4_4_);
          uVar52 = -(uint)(local_2e8 <= auVar69._8_4_);
          uVar54 = -(uint)(local_2e8 <= auVar69._12_4_);
          fVar281 = (float)((uint)fVar100 & uVar49 | ~uVar49 & (uint)fVar259);
          fVar250 = (float)((uint)fVar124 & uVar50 | ~uVar50 & (uint)fVar261);
          fVar284 = (float)((uint)fVar123 & uVar52 | ~uVar52 & (uint)fVar268);
          fVar270 = (float)((uint)fVar127 & uVar54 | ~uVar54 & (uint)fVar270);
          fVar244 = (float)(~uVar49 & (uint)local_228 | (uint)fVar231 & uVar49);
          fVar246 = (float)(~uVar50 & (uint)fStack_224 | (uint)fVar232 & uVar50);
          fVar259 = (float)(~uVar52 & (uint)fStack_220 | (uint)fVar291 & uVar52);
          fVar268 = (float)(~uVar54 & (uint)fStack_21c | (uint)fVar214 & uVar54);
          fVar223 = auVar254._0_4_;
          fVar125 = auVar254._4_4_;
          fVar130 = auVar254._8_4_;
          fVar142 = auVar254._12_4_;
          auVar168._0_4_ = fVar200 * fVar200 + fVar223 * fVar223;
          auVar168._4_4_ = fVar234 * fVar234 + fVar125 * fVar125;
          auVar168._8_4_ = fVar225 * fVar225 + fVar130 * fVar130;
          auVar168._12_4_ = fVar229 * fVar229 + fVar142 * fVar142;
          auVar69 = rsqrtps(auVar197,auVar168);
          fVar156 = auVar69._0_4_;
          fVar158 = auVar69._4_4_;
          fVar209 = auVar69._8_4_;
          fVar211 = auVar69._12_4_;
          auVar198._0_4_ = fVar156 * fVar156 * auVar168._0_4_ * 0.5 * fVar156;
          auVar198._4_4_ = fVar158 * fVar158 * auVar168._4_4_ * 0.5 * fVar158;
          auVar198._8_4_ = fVar209 * fVar209 * auVar168._8_4_ * 0.5 * fVar209;
          auVar198._12_4_ = fVar211 * fVar211 * auVar168._12_4_ * 0.5 * fVar211;
          fVar239 = fVar156 * 1.5 - auVar198._0_4_;
          fVar240 = fVar158 * 1.5 - auVar198._4_4_;
          fVar241 = fVar209 * 1.5 - auVar198._8_4_;
          fVar243 = fVar211 * 1.5 - auVar198._12_4_;
          auVar169._0_4_ = fVar244 * fVar244 + fVar281 * fVar281;
          auVar169._4_4_ = fVar246 * fVar246 + fVar250 * fVar250;
          auVar169._8_4_ = fVar259 * fVar259 + fVar284 * fVar284;
          auVar169._12_4_ = fVar268 * fVar268 + fVar270 * fVar270;
          auVar69 = rsqrtps(auVar198,auVar169);
          fVar156 = auVar69._0_4_;
          fVar158 = auVar69._4_4_;
          fVar209 = auVar69._8_4_;
          fVar211 = auVar69._12_4_;
          fVar199 = fVar156 * 1.5 - fVar156 * fVar156 * auVar169._0_4_ * 0.5 * fVar156;
          fVar158 = fVar158 * 1.5 - fVar158 * fVar158 * auVar169._4_4_ * 0.5 * fVar158;
          fVar227 = fVar209 * 1.5 - fVar209 * fVar209 * auVar169._8_4_ * 0.5 * fVar209;
          fVar211 = fVar211 * 1.5 - fVar211 * fVar211 * auVar169._12_4_ * 0.5 * fVar211;
          fVar224 = fVar200 * fVar239 * (float)local_3e8;
          fVar228 = fVar234 * fVar240 * (float)auStack_3e4._0_4_;
          fVar231 = fVar225 * fVar241 * (float)auStack_3e4._4_4_;
          fVar291 = fVar229 * fVar243 * fStack_3dc;
          fVar209 = -fVar223 * fVar239 * (float)local_3e8;
          fVar223 = -fVar125 * fVar240 * (float)auStack_3e4._0_4_;
          fVar200 = -fVar130 * fVar241 * (float)auStack_3e4._4_4_;
          fVar234 = -fVar142 * fVar243 * fStack_3dc;
          fVar245 = fVar239 * 0.0 * (float)local_3e8;
          fVar257 = fVar240 * 0.0 * (float)auStack_3e4._0_4_;
          fVar261 = fVar241 * 0.0 * (float)auStack_3e4._4_4_;
          fVar269 = fVar243 * 0.0 * fStack_3dc;
          fVar251 = fVar244 * fVar199 * auVar266._0_4_;
          fVar58 = fVar246 * fVar158 * auVar266._4_4_;
          fVar96 = fVar259 * fVar227 * auVar266._8_4_;
          fVar101 = fVar268 * fVar211 * auVar266._12_4_;
          fVar286 = (float)local_208._0_4_ + fVar251;
          fVar288 = (float)local_208._4_4_ + fVar58;
          fVar143 = fStack_200 + fVar96;
          fVar157 = fStack_1fc + fVar101;
          fVar125 = -fVar281 * fVar199 * auVar266._0_4_;
          fVar130 = -fVar250 * fVar158 * auVar266._4_4_;
          fVar142 = -fVar284 * fVar227 * auVar266._8_4_;
          fVar156 = -fVar270 * fVar211 * auVar266._12_4_;
          fVar159 = fVar271 + fVar125;
          fVar160 = fVar277 + fVar130;
          fVar162 = fVar279 + fVar142;
          fVar173 = fVar290 + fVar156;
          fVar239 = fVar199 * 0.0 * auVar266._0_4_;
          fVar240 = fVar158 * 0.0 * auVar266._4_4_;
          fVar241 = fVar227 * 0.0 * auVar266._8_4_;
          fVar243 = fVar211 * 0.0 * auVar266._12_4_;
          fVar244 = fVar293 - fVar224;
          fVar246 = fVar272 - fVar228;
          fVar259 = fVar278 - fVar231;
          fVar268 = fVar280 - fVar291;
          fVar225 = fVar175 + fVar239;
          fVar229 = fVar202 + fVar240;
          fVar232 = fVar212 + fVar241;
          fVar214 = fVar216 + fVar243;
          fVar270 = local_198 - fVar209;
          fVar281 = fStack_194 - fVar223;
          fVar250 = fStack_190 - fVar200;
          fVar284 = fStack_18c - fVar234;
          fVar158 = fVar176 - fVar245;
          fVar211 = fVar210 - fVar257;
          fVar199 = fVar213 - fVar261;
          fVar227 = fVar217 - fVar269;
          uVar49 = -(uint)(0.0 < (fVar270 * (fVar225 - fVar158) - fVar158 * (fVar159 - fVar270)) *
                                 0.0 + (fVar158 * (fVar286 - fVar244) -
                                       (fVar225 - fVar158) * fVar244) * 0.0 +
                                       ((fVar159 - fVar270) * fVar244 -
                                       (fVar286 - fVar244) * fVar270));
          uVar50 = -(uint)(0.0 < (fVar281 * (fVar229 - fVar211) - fVar211 * (fVar160 - fVar281)) *
                                 0.0 + (fVar211 * (fVar288 - fVar246) -
                                       (fVar229 - fVar211) * fVar246) * 0.0 +
                                       ((fVar160 - fVar281) * fVar246 -
                                       (fVar288 - fVar246) * fVar281));
          uVar52 = -(uint)(0.0 < (fVar250 * (fVar232 - fVar199) - fVar199 * (fVar162 - fVar250)) *
                                 0.0 + (fVar199 * (fVar143 - fVar259) -
                                       (fVar232 - fVar199) * fVar259) * 0.0 +
                                       ((fVar162 - fVar250) * fVar259 -
                                       (fVar143 - fVar259) * fVar250));
          uVar54 = -(uint)(0.0 < (fVar284 * (fVar214 - fVar227) - fVar227 * (fVar173 - fVar284)) *
                                 0.0 + (fVar227 * (fVar157 - fVar268) -
                                       (fVar214 - fVar227) * fVar268) * 0.0 +
                                       ((fVar173 - fVar284) * fVar268 -
                                       (fVar157 - fVar268) * fVar284));
          fVar293 = (float)((uint)((float)local_208._0_4_ - fVar251) & uVar49 |
                           ~uVar49 & (uint)(fVar293 + fVar224));
          fVar272 = (float)((uint)((float)local_208._4_4_ - fVar58) & uVar50 |
                           ~uVar50 & (uint)(fVar272 + fVar228));
          fVar278 = (float)((uint)(fStack_200 - fVar96) & uVar52 |
                           ~uVar52 & (uint)(fVar278 + fVar231));
          fVar280 = (float)((uint)(fStack_1fc - fVar101) & uVar54 |
                           ~uVar54 & (uint)(fVar280 + fVar291));
          fVar224 = (float)((uint)(fVar271 - fVar125) & uVar49 |
                           ~uVar49 & (uint)(local_198 + fVar209));
          fVar228 = (float)((uint)(fVar277 - fVar130) & uVar50 |
                           ~uVar50 & (uint)(fStack_194 + fVar223));
          fStack_430 = (float)((uint)(fVar279 - fVar142) & uVar52 |
                              ~uVar52 & (uint)(fStack_190 + fVar200));
          fStack_42c = (float)((uint)(fVar290 - fVar156) & uVar54 |
                              ~uVar54 & (uint)(fStack_18c + fVar234));
          fVar239 = (float)((uint)(fVar175 - fVar239) & uVar49 | ~uVar49 & (uint)(fVar176 + fVar245)
                           );
          fVar240 = (float)((uint)(fVar202 - fVar240) & uVar50 | ~uVar50 & (uint)(fVar210 + fVar257)
                           );
          fVar241 = (float)((uint)(fVar212 - fVar241) & uVar52 | ~uVar52 & (uint)(fVar213 + fVar261)
                           );
          fVar243 = (float)((uint)(fVar216 - fVar243) & uVar54 | ~uVar54 & (uint)(fVar217 + fVar269)
                           );
          fVar245 = (float)((uint)fVar244 & uVar49 | ~uVar49 & (uint)fVar286);
          fVar257 = (float)((uint)fVar246 & uVar50 | ~uVar50 & (uint)fVar288);
          fVar261 = (float)((uint)fVar259 & uVar52 | ~uVar52 & (uint)fVar143);
          fVar269 = (float)((uint)fVar268 & uVar54 | ~uVar54 & (uint)fVar157);
          fVar271 = (float)((uint)fVar270 & uVar49 | ~uVar49 & (uint)fVar159);
          fVar277 = (float)((uint)fVar281 & uVar50 | ~uVar50 & (uint)fVar160);
          fVar279 = (float)((uint)fVar250 & uVar52 | ~uVar52 & (uint)fVar162);
          fVar290 = (float)((uint)fVar284 & uVar54 | ~uVar54 & (uint)fVar173);
          fVar209 = (float)((uint)fVar158 & uVar49 | ~uVar49 & (uint)fVar225);
          fVar223 = (float)((uint)fVar211 & uVar50 | ~uVar50 & (uint)fVar229);
          fVar200 = (float)((uint)fVar199 & uVar52 | ~uVar52 & (uint)fVar232);
          fVar234 = (float)((uint)fVar227 & uVar54 | ~uVar54 & (uint)fVar214);
          fVar244 = (float)((uint)fVar286 & uVar49 | ~uVar49 & (uint)fVar244) - fVar293;
          fVar246 = (float)((uint)fVar288 & uVar50 | ~uVar50 & (uint)fVar246) - fVar272;
          fVar259 = (float)((uint)fVar143 & uVar52 | ~uVar52 & (uint)fVar259) - fVar278;
          fVar268 = (float)((uint)fVar157 & uVar54 | ~uVar54 & (uint)fVar268) - fVar280;
          fVar270 = (float)((uint)fVar159 & uVar49 | ~uVar49 & (uint)fVar270) - fVar224;
          fVar281 = (float)((uint)fVar160 & uVar50 | ~uVar50 & (uint)fVar281) - fVar228;
          fVar250 = (float)((uint)fVar162 & uVar52 | ~uVar52 & (uint)fVar250) - fStack_430;
          fVar284 = (float)((uint)fVar173 & uVar54 | ~uVar54 & (uint)fVar284) - fStack_42c;
          fVar286 = (float)((uint)fVar225 & uVar49 | ~uVar49 & (uint)fVar158) - fVar239;
          fVar288 = (float)((uint)fVar229 & uVar50 | ~uVar50 & (uint)fVar211) - fVar240;
          fVar143 = (float)((uint)fVar232 & uVar52 | ~uVar52 & (uint)fVar199) - fVar241;
          fVar157 = (float)((uint)fVar214 & uVar54 | ~uVar54 & (uint)fVar227) - fVar243;
          fVar175 = fVar293 - fVar245;
          fVar176 = fVar272 - fVar257;
          fVar202 = fVar278 - fVar261;
          fVar210 = fVar280 - fVar269;
          fVar125 = fVar224 - fVar271;
          fVar130 = fVar228 - fVar277;
          fVar142 = fStack_430 - fVar279;
          fVar156 = fStack_42c - fVar290;
          local_438 = CONCAT44(fVar228,fVar224);
          fVar158 = fVar239 - fVar209;
          fVar211 = fVar240 - fVar223;
          fVar199 = fVar241 - fVar200;
          fVar227 = fVar243 - fVar234;
          fVar159 = (fVar224 * fVar286 - fVar239 * fVar270) * 0.0 +
                    (fVar239 * fVar244 - fVar293 * fVar286) * 0.0 +
                    (fVar293 * fVar270 - fVar224 * fVar244);
          fVar160 = (fVar228 * fVar288 - fVar240 * fVar281) * 0.0 +
                    (fVar240 * fVar246 - fVar272 * fVar288) * 0.0 +
                    (fVar272 * fVar281 - fVar228 * fVar246);
          auVar151._4_4_ = fVar160;
          auVar151._0_4_ = fVar159;
          fVar162 = (fStack_430 * fVar143 - fVar241 * fVar250) * 0.0 +
                    (fVar241 * fVar259 - fVar278 * fVar143) * 0.0 +
                    (fVar278 * fVar250 - fStack_430 * fVar259);
          fVar173 = (fStack_42c * fVar157 - fVar243 * fVar284) * 0.0 +
                    (fVar243 * fVar268 - fVar280 * fVar157) * 0.0 +
                    (fVar280 * fVar284 - fStack_42c * fVar268);
          auVar283._0_4_ =
               (fVar271 * fVar158 - fVar209 * fVar125) * 0.0 +
               (fVar209 * fVar175 - fVar245 * fVar158) * 0.0 +
               (fVar245 * fVar125 - fVar271 * fVar175);
          auVar283._4_4_ =
               (fVar277 * fVar211 - fVar223 * fVar130) * 0.0 +
               (fVar223 * fVar176 - fVar257 * fVar211) * 0.0 +
               (fVar257 * fVar130 - fVar277 * fVar176);
          auVar283._8_4_ =
               (fVar279 * fVar199 - fVar200 * fVar142) * 0.0 +
               (fVar200 * fVar202 - fVar261 * fVar199) * 0.0 +
               (fVar261 * fVar142 - fVar279 * fVar202);
          auVar283._12_4_ =
               (fVar290 * fVar227 - fVar234 * fVar156) * 0.0 +
               (fVar234 * fVar210 - fVar269 * fVar227) * 0.0 +
               (fVar269 * fVar156 - fVar290 * fVar210);
          auVar151._8_4_ = fVar162;
          auVar151._12_4_ = fVar173;
          auVar69 = maxps(auVar151,auVar283);
          bVar30 = auVar69._0_4_ <= 0.0 && bVar30;
          auVar152._0_4_ = -(uint)bVar30;
          bVar29 = auVar69._4_4_ <= 0.0 && bVar29;
          auVar152._4_4_ = -(uint)bVar29;
          bVar31 = auVar69._8_4_ <= 0.0 && bVar31;
          auVar152._8_4_ = -(uint)bVar31;
          bVar32 = auVar69._12_4_ <= 0.0 && bVar32;
          auVar152._12_4_ = -(uint)bVar32;
          iVar36 = movmskps((int)puVar39,auVar152);
          if (iVar36 == 0) {
LAB_00302274:
            auVar136._8_8_ = uVar35;
            auVar136._0_8_ = uVar34;
          }
          else {
            fVar209 = (ray->super_RayK<1>).tfar;
            fVar200 = fVar125 * fVar286 - fVar158 * fVar270;
            fVar234 = fVar130 * fVar288 - fVar211 * fVar281;
            fVar245 = fVar142 * fVar143 - fVar199 * fVar250;
            fVar257 = fVar156 * fVar157 - fVar227 * fVar284;
            fVar158 = fVar158 * fVar244 - fVar286 * fVar175;
            fVar211 = fVar211 * fVar246 - fVar288 * fVar176;
            fVar223 = fVar199 * fVar259 - fVar143 * fVar202;
            fVar199 = fVar227 * fVar268 - fVar157 * fVar210;
            fVar227 = fVar175 * fVar270 - fVar125 * fVar244;
            fVar244 = fVar176 * fVar281 - fVar130 * fVar246;
            fVar246 = fVar202 * fVar250 - fVar142 * fVar259;
            fVar259 = fVar210 * fVar284 - fVar156 * fVar268;
            auVar135._0_4_ = fVar158 * 0.0 + fVar227;
            auVar135._4_4_ = fVar211 * 0.0 + fVar244;
            auVar135._8_4_ = fVar223 * 0.0 + fVar246;
            auVar135._12_4_ = fVar199 * 0.0 + fVar259;
            auVar208._0_4_ = fVar200 * 0.0 + auVar135._0_4_;
            auVar208._4_4_ = fVar234 * 0.0 + auVar135._4_4_;
            auVar208._8_4_ = fVar245 * 0.0 + auVar135._8_4_;
            auVar208._12_4_ = fVar257 * 0.0 + auVar135._12_4_;
            auVar69 = rcpps(auVar135,auVar208);
            fVar125 = auVar69._0_4_;
            fVar130 = auVar69._4_4_;
            fVar142 = auVar69._8_4_;
            fVar156 = auVar69._12_4_;
            fVar125 = (1.0 - auVar208._0_4_ * fVar125) * fVar125 + fVar125;
            fVar130 = (1.0 - auVar208._4_4_ * fVar130) * fVar130 + fVar130;
            fVar142 = (1.0 - auVar208._8_4_ * fVar142) * fVar142 + fVar142;
            fVar156 = (1.0 - auVar208._12_4_ * fVar156) * fVar156 + fVar156;
            fVar158 = (fVar239 * fVar227 + fVar224 * fVar158 + fVar293 * fVar200) * fVar125;
            fVar211 = (fVar240 * fVar244 + fVar228 * fVar211 + fVar272 * fVar234) * fVar130;
            fVar223 = (fVar241 * fVar246 + fStack_430 * fVar223 + fVar278 * fVar245) * fVar142;
            fVar199 = (fVar243 * fVar259 + fStack_42c * fVar199 + fVar280 * fVar257) * fVar156;
            bVar30 = (local_1e8 <= fVar158 && fVar158 <= fVar209) && bVar30;
            auVar170._0_4_ = -(uint)bVar30;
            bVar29 = (fStack_1e4 <= fVar211 && fVar211 <= fVar209) && bVar29;
            auVar170._4_4_ = -(uint)bVar29;
            bVar31 = (fStack_1e0 <= fVar223 && fVar223 <= fVar209) && bVar31;
            auVar170._8_4_ = -(uint)bVar31;
            bVar32 = (fStack_1dc <= fVar199 && fVar199 <= fVar209) && bVar32;
            auVar170._12_4_ = -(uint)bVar32;
            iVar36 = movmskps(iVar36,auVar170);
            if (iVar36 == 0) goto LAB_00302274;
            auVar171._0_8_ =
                 CONCAT44(-(uint)(auVar208._4_4_ != 0.0 && bVar29),
                          -(uint)(auVar208._0_4_ != 0.0 && bVar30));
            auVar171._8_4_ = -(uint)(auVar208._8_4_ != 0.0 && bVar31);
            auVar171._12_4_ = -(uint)(auVar208._12_4_ != 0.0 && bVar32);
            iVar36 = movmskps(iVar36,auVar171);
            auVar136._8_8_ = uVar35;
            auVar136._0_8_ = uVar34;
            if (iVar36 != 0) {
              fVar159 = fVar159 * fVar125;
              fVar160 = fVar160 * fVar130;
              fVar162 = fVar162 * fVar142;
              fVar173 = fVar173 * fVar156;
              local_418 = (float)((uint)(1.0 - fVar159) & uVar49 | ~uVar49 & (uint)fVar159);
              fStack_414 = (float)((uint)(1.0 - fVar160) & uVar50 | ~uVar50 & (uint)fVar160);
              fStack_410 = (float)((uint)(1.0 - fVar162) & uVar52 | ~uVar52 & (uint)fVar162);
              fStack_40c = (float)((uint)(1.0 - fVar173) & uVar54 | ~uVar54 & (uint)fVar173);
              auVar136._8_4_ = auVar171._8_4_;
              auVar136._0_8_ = auVar171._0_8_;
              auVar136._12_4_ = auVar171._12_4_;
              local_1c8 = (float)(~uVar49 & (uint)(auVar283._0_4_ * fVar125) |
                                 (uint)(1.0 - auVar283._0_4_ * fVar125) & uVar49);
              fStack_1c4 = (float)(~uVar50 & (uint)(auVar283._4_4_ * fVar130) |
                                  (uint)(1.0 - auVar283._4_4_ * fVar130) & uVar50);
              fStack_1c0 = (float)(~uVar52 & (uint)(auVar283._8_4_ * fVar142) |
                                  (uint)(1.0 - auVar283._8_4_ * fVar142) & uVar52);
              fStack_1bc = (float)(~uVar54 & (uint)(auVar283._12_4_ * fVar156) |
                                  (uint)(1.0 - auVar283._12_4_ * fVar156) & uVar54);
              local_2c8 = fVar158;
              fStack_2c4 = fVar211;
              fStack_2c0 = fVar223;
              fStack_2bc = fVar199;
            }
          }
          uVar49 = movmskps(iVar36,auVar136);
          puVar39 = (undefined1 *)(ulong)uVar49;
          if (uVar49 != 0) {
            fVar130 = (auVar266._0_4_ - (float)local_3e8) * local_418 + (float)local_3e8;
            fVar142 = (auVar266._4_4_ - (float)auStack_3e4._0_4_) * fStack_414 +
                      (float)auStack_3e4._0_4_;
            fVar156 = (auVar266._8_4_ - (float)auStack_3e4._4_4_) * fStack_410 +
                      (float)auStack_3e4._4_4_;
            fVar158 = (auVar266._12_4_ - fStack_3dc) * fStack_40c + fStack_3dc;
            fVar125 = pre->depth_scale;
            aVar90._0_4_ = -(uint)(fVar125 * (fVar130 + fVar130) < local_2c8) & auVar136._0_4_;
            aVar90._4_4_ = -(uint)(fVar125 * (fVar142 + fVar142) < fStack_2c4) & auVar136._4_4_;
            aVar90.i[2] = -(uint)(fVar125 * (fVar156 + fVar156) < fStack_2c0) & auVar136._8_4_;
            aVar90.i[3] = -(uint)(fVar125 * (fVar158 + fVar158) < fStack_2bc) & auVar136._12_4_;
            uVar49 = movmskps(uVar49,(undefined1  [16])aVar90);
            puVar39 = (undefined1 *)(ulong)uVar49;
            if (uVar49 != 0) {
              local_1c8 = local_1c8 + local_1c8 + -1.0;
              fStack_1c4 = fStack_1c4 + fStack_1c4 + -1.0;
              fStack_1c0 = fStack_1c0 + fStack_1c0 + -1.0;
              fStack_1bc = fStack_1bc + fStack_1bc + -1.0;
              bhit.U.field_0.v[1] = fStack_414;
              bhit.U.field_0.v[0] = local_418;
              bhit.U.field_0.v[2] = fStack_410;
              bhit.U.field_0.v[3] = fStack_40c;
              bhit.V.field_0.v[0] = local_1c8;
              bhit.V.field_0.v[1] = fStack_1c4;
              bhit.V.field_0.v[2] = fStack_1c0;
              bhit.V.field_0.v[3] = fStack_1bc;
              bhit.T.field_0.v[1] = fStack_2c4;
              bhit.T.field_0.v[0] = local_2c8;
              bhit.T.field_0.v[2] = fStack_2c0;
              bhit.T.field_0.v[3] = fStack_2bc;
              bhit.curve3D.v0.field_0._0_8_ = CONCAT44(fStack_384,local_388);
              bhit.curve3D.v0.field_0._8_8_ = CONCAT44(fStack_37c,fStack_380);
              bhit.curve3D.v1.field_0.m128[0] = local_3f8;
              bhit.curve3D.v1.field_0.m128[1] = fStack_3f4;
              bhit.curve3D.v1.field_0.m128[2] = fStack_3f0;
              bhit.curve3D.v1.field_0.m128[3] = fStack_3ec;
              bhit.curve3D.v2.field_0.m128[0] = local_408;
              bhit.curve3D.v2.field_0.m128[1] = fStack_404;
              bhit.curve3D.v2.field_0.m128[2] = fStack_400;
              bhit.curve3D.v2.field_0.m128[3] = fStack_3fc;
              bhit.curve3D.v3.field_0._0_8_ = uVar11;
              bhit.curve3D.v3.field_0._8_8_ = uVar33;
              bhit.valid.field_0 = aVar90;
              pGVar7 = (context->scene->geometries).items[local_420].ptr;
              uVar49 = (ray->super_RayK<1>).mask;
              puVar39 = (undefined1 *)(ulong)uVar49;
              pGVar42 = pGVar7;
              if ((pGVar7->mask & uVar49) != 0) {
                valid.field_0 = aVar90;
                fVar125 = (float)bhit.i;
                bhit.vu.field_0.v[0] = (fVar125 + local_418 + 0.0) * fVar122;
                bhit.vu.field_0.v[1] = (fVar125 + fStack_414 + 1.0) * fVar122;
                bhit.vu.field_0.v[2] = (fVar125 + fStack_410 + 2.0) * fVar122;
                bhit.vu.field_0.v[3] = (fVar125 + fStack_40c + 3.0) * fVar122;
                bhit.vv.field_0._0_8_ = CONCAT44(fStack_1c4,local_1c8);
                bhit.vv.field_0._8_8_ = CONCAT44(fStack_1bc,fStack_1c0);
                bhit.vt.field_0.v[1] = fStack_2c4;
                bhit.vt.field_0.v[0] = local_2c8;
                bhit.vt.field_0.v[2] = fStack_2c0;
                bhit.vt.field_0.v[3] = fStack_2bc;
                auVar113._0_4_ = aVar90._0_4_ & (uint)local_2c8;
                auVar113._4_4_ = aVar90._4_4_ & (uint)fStack_2c4;
                auVar113._8_4_ = aVar90.i[2] & (uint)fStack_2c0;
                auVar113._12_4_ = aVar90.i[3] & (uint)fStack_2bc;
                auVar137._0_8_ = CONCAT44(~aVar90._4_4_,~aVar90._0_4_) & 0x7f8000007f800000;
                auVar137._8_4_ = ~aVar90.i[2] & 0x7f800000;
                auVar137._12_4_ = ~aVar90.i[3] & 0x7f800000;
                auVar137 = auVar137 | auVar113;
                auVar153._4_4_ = auVar137._0_4_;
                auVar153._0_4_ = auVar137._4_4_;
                auVar153._8_4_ = auVar137._12_4_;
                auVar153._12_4_ = auVar137._8_4_;
                auVar69 = minps(auVar153,auVar137);
                auVar114._0_8_ = auVar69._8_8_;
                auVar114._8_4_ = auVar69._0_4_;
                auVar114._12_4_ = auVar69._4_4_;
                auVar69 = minps(auVar114,auVar69);
                auVar115._0_8_ =
                     CONCAT44(-(uint)(auVar69._4_4_ == auVar137._4_4_) & aVar90._4_4_,
                              -(uint)(auVar69._0_4_ == auVar137._0_4_) & aVar90._0_4_);
                auVar115._8_4_ = -(uint)(auVar69._8_4_ == auVar137._8_4_) & aVar90.i[2];
                auVar115._12_4_ = -(uint)(auVar69._12_4_ == auVar137._12_4_) & aVar90.i[3];
                iVar36 = movmskps(uVar49,auVar115);
                if (iVar36 != 0) {
                  aVar90.i[2] = auVar115._8_4_;
                  aVar90._0_8_ = auVar115._0_8_;
                  aVar90.i[3] = auVar115._12_4_;
                }
                uVar49 = movmskps(iVar36,(undefined1  [16])aVar90);
                lVar47 = 0;
                if (uVar49 != 0) {
                  for (; (uVar49 >> lVar47 & 1) == 0; lVar47 = lVar47 + 1) {
                  }
                }
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar125 = bhit.vu.field_0.v[lVar47];
                  fVar142 = 1.0 - fVar125;
                  fVar130 = fVar125 * 3.0;
                  fVar209 = ((fVar130 + 2.0) * (fVar142 + fVar142) + fVar142 * -3.0 * fVar142) * 0.5
                  ;
                  fVar156 = (fVar142 * -2.0 * fVar125 + fVar125 * fVar125) * 0.5;
                  fVar158 = (fVar125 * fVar130 + (fVar130 + -5.0) * (fVar125 + fVar125)) * 0.5;
                  fVar130 = bhit.vv.field_0.v[lVar47];
                  fVar142 = (fVar125 * (fVar142 + fVar142) - fVar142 * fVar142) * 0.5;
                  (ray->super_RayK<1>).tfar = bhit.vt.field_0.v[lVar47];
                  *(ulong *)&(ray->Ng).field_0 =
                       CONCAT44(fVar142 * fStack_384 +
                                fVar158 * fStack_3f4 + fVar209 * fStack_404 + fVar156 * fVar174,
                                fVar142 * local_388 +
                                fVar158 * local_3f8 + fVar209 * local_408 + fVar156 * fVar172);
                  (ray->Ng).field_0.field_0.z =
                       fVar142 * fStack_380 +
                       fVar158 * fStack_3f0 + fVar209 * fStack_400 + fVar156 * fVar215;
                  ray->u = fVar125;
                  ray->v = fVar130;
                  ray->primID = (uint)local_3b0;
                  ray->geomID = (uint)local_420;
                  ray->instID[0] = context->user->instID[0];
                  uVar49 = context->user->instPrimID[0];
                  puVar39 = (undefined1 *)(ulong)uVar49;
                  ray->instPrimID[0] = uVar49;
                }
                else {
                  local_3e8 = (undefined1  [4])bhit.N;
                  local_438 = lVar43;
                  _local_498 = ZEXT416((uint)(ray->super_RayK<1>).tfar);
                  fVar125 = local_408;
                  fVar130 = fStack_404;
                  fVar142 = fStack_400;
                  fVar156 = local_3f8;
                  fVar158 = fStack_3f4;
                  fVar209 = fStack_3f0;
LAB_003022cc:
                  local_25c = bhit.vu.field_0.v[lVar47];
                  local_258 = bhit.vv.field_0.v[lVar47];
                  (ray->super_RayK<1>).tfar = bhit.vt.field_0.v[lVar47];
                  fVar211 = 1.0 - local_25c;
                  fVar199 = local_25c * 3.0;
                  fVar200 = ((fVar199 + 2.0) * (fVar211 + fVar211) + fVar211 * -3.0 * fVar211) * 0.5
                  ;
                  fVar223 = (fVar211 * -2.0 * local_25c + local_25c * local_25c) * 0.5;
                  fVar199 = (local_25c * fVar199 + (fVar199 + -5.0) * (local_25c + local_25c)) * 0.5
                  ;
                  fVar211 = (local_25c * (fVar211 + fVar211) - fVar211 * fVar211) * 0.5;
                  args.context = context->user;
                  local_268 = CONCAT44(fVar211 * fStack_384 +
                                       fVar199 * fVar158 + fVar200 * fVar130 + fVar223 * fVar174,
                                       fVar211 * local_388 +
                                       fVar199 * fVar156 + fVar200 * fVar125 + fVar223 * fVar172);
                  local_260 = fVar211 * fStack_380 +
                              fVar199 * fVar209 + fVar200 * fVar142 + fVar223 * fVar215;
                  local_254 = (int)local_3b0;
                  local_250 = (int)local_420;
                  local_24c = (args.context)->instID[0];
                  local_248 = (args.context)->instPrimID[0];
                  local_47c = -1;
                  args.valid = &local_47c;
                  args.geometryUserPtr = pGVar7->userPtr;
                  args.ray = (RTCRayN *)ray;
                  args.hit = (RTCHitN *)&local_268;
                  args.N = 1;
                  if ((pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar7->intersectionFilterN)(&args), pGVar42 = extraout_RDX,
                     context = local_3b8, fVar125 = local_408, fVar130 = fStack_404,
                     fVar142 = fStack_400, fVar156 = local_3f8, fVar158 = fStack_3f4,
                     fVar209 = fStack_3f0, *args.valid != 0)) {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                          RTC_RAY_QUERY_FLAG_INCOHERENT ||
                         (((pGVar7->field_8).field_0x2 & 0x40) != 0)) &&
                        ((*p_Var9)(&args), pGVar42 = extraout_RDX_00, context = local_3b8,
                        fVar125 = local_408, fVar130 = fStack_404, fVar142 = fStack_400,
                        fVar156 = local_3f8, fVar158 = fStack_3f4, fVar209 = fStack_3f0,
                        *args.valid == 0)))) goto LAB_00302558;
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    pGVar42 = (Geometry *)(ulong)*(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                    *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
                    pRVar40 = args.ray;
                  }
                  else {
LAB_00302558:
                    (ray->super_RayK<1>).tfar = (float)local_498._0_4_;
                    pRVar40 = (RTCRayN *)args.valid;
                    context = local_3b8;
                    fVar125 = local_408;
                    fVar130 = fStack_404;
                    fVar142 = fStack_400;
                    fVar156 = local_3f8;
                    fVar158 = fStack_3f4;
                    fVar209 = fStack_3f0;
                  }
                  valid.field_0.v[lVar47] = 0.0;
                  fVar211 = (ray->super_RayK<1>).tfar;
                  local_498._0_4_ = (ray->super_RayK<1>).tfar;
                  local_498._4_4_ = (ray->super_RayK<1>).mask;
                  fStack_490 = (float)(ray->super_RayK<1>).id;
                  fStack_48c = (float)(ray->super_RayK<1>).flags;
                  aVar91._0_4_ = -(uint)(local_2c8 <= fVar211) & valid.field_0.i[0];
                  aVar91._4_4_ = -(uint)(fStack_2c4 <= fVar211) & valid.field_0.i[1];
                  aVar91.i[2] = -(uint)(fStack_2c0 <= fVar211) & valid.field_0.i[2];
                  aVar91.i[3] = -(uint)(fStack_2bc <= fVar211) & valid.field_0.i[3];
                  valid.field_0 = aVar91;
                  uVar41 = (undefined4)((ulong)pRVar40 >> 0x20);
                  iVar36 = movmskps((int)pRVar40,(undefined1  [16])aVar91);
                  puVar39 = (undefined1 *)CONCAT44(uVar41,iVar36);
                  if (iVar36 != 0) {
                    auVar116._0_4_ = aVar91._0_4_ & (uint)local_2c8;
                    auVar116._4_4_ = aVar91._4_4_ & (uint)fStack_2c4;
                    auVar116._8_4_ = aVar91.i[2] & (uint)fStack_2c0;
                    auVar116._12_4_ = aVar91.i[3] & (uint)fStack_2bc;
                    auVar138._0_8_ = CONCAT44(~aVar91._4_4_,~aVar91._0_4_) & 0x7f8000007f800000;
                    auVar138._8_4_ = ~aVar91.i[2] & 0x7f800000;
                    auVar138._12_4_ = ~aVar91.i[3] & 0x7f800000;
                    auVar138 = auVar138 | auVar116;
                    auVar154._4_4_ = auVar138._0_4_;
                    auVar154._0_4_ = auVar138._4_4_;
                    auVar154._8_4_ = auVar138._12_4_;
                    auVar154._12_4_ = auVar138._8_4_;
                    auVar69 = minps(auVar154,auVar138);
                    auVar117._0_8_ = auVar69._8_8_;
                    auVar117._8_4_ = auVar69._0_4_;
                    auVar117._12_4_ = auVar69._4_4_;
                    auVar69 = minps(auVar117,auVar69);
                    auVar118._0_8_ =
                         CONCAT44(-(uint)(auVar69._4_4_ == auVar138._4_4_) & aVar91._4_4_,
                                  -(uint)(auVar69._0_4_ == auVar138._0_4_) & aVar91._0_4_);
                    auVar118._8_4_ = -(uint)(auVar69._8_4_ == auVar138._8_4_) & aVar91.i[2];
                    auVar118._12_4_ = -(uint)(auVar69._12_4_ == auVar138._12_4_) & aVar91.i[3];
                    iVar36 = movmskps(iVar36,auVar118);
                    if (iVar36 != 0) {
                      aVar91.i[2] = auVar118._8_4_;
                      aVar91._0_8_ = auVar118._0_8_;
                      aVar91.i[3] = auVar118._12_4_;
                    }
                    uVar37 = movmskps(iVar36,(undefined1  [16])aVar91);
                    uVar38 = CONCAT44(uVar41,uVar37);
                    lVar47 = 0;
                    if (uVar38 != 0) {
                      for (; (uVar38 >> lVar47 & 1) == 0; lVar47 = lVar47 + 1) {
                      }
                    }
                    goto LAB_003022cc;
                  }
                  lVar43 = local_438;
                  bhit.N = (int)local_3e8;
                }
              }
            }
          }
        }
        lVar44 = lVar44 + 4;
      }
    }
    fVar141 = (ray->super_RayK<1>).tfar;
    auVar112._4_4_ = -(uint)(fVar95 <= fVar141);
    auVar112._0_4_ = -(uint)(fVar57 <= fVar141);
    auVar112._8_4_ = -(uint)(fVar97 <= fVar141);
    auVar112._12_4_ = -(uint)(fVar99 <= fVar141);
    uVar49 = movmskps(uVar41,auVar112);
    uVar49 = (uint)uVar48 & uVar49;
    aVar252 = local_468;
    aVar265 = local_458;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }